

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

bool embree::avx512::CurveNiIntersectorK<8,16>::
     occluded_n<embree::avx512::OrientedCurve1IntersectorK<embree::CatmullRomCurveT,16>,embree::avx512::Occluded1KEpilog1<16,true>>
               (Precalculations *pre,RayK<16> *ray,size_t k,RayQueryContext *context,Primitive *prim
               )

{
  uint uVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  Primitive PVar7;
  uint uVar8;
  Geometry *pGVar9;
  RTCFilterFunctionN p_Var10;
  void *pvVar11;
  __int_type_conflict _Var12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  ulong uVar27;
  uint uVar28;
  ulong uVar29;
  long lVar30;
  byte bVar31;
  uint uVar32;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  ulong uVar34;
  ulong uVar35;
  uint uVar36;
  bool bVar37;
  bool bVar38;
  bool bVar39;
  bool bVar40;
  bool bVar41;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar55 [16];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [64];
  undefined1 auVar89 [64];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar90 [64];
  undefined1 auVar91 [64];
  undefined1 auVar93 [64];
  undefined1 auVar95 [64];
  undefined1 auVar97 [64];
  undefined1 auVar99 [64];
  undefined1 auVar101 [64];
  undefined1 auVar103 [64];
  undefined1 auVar104 [64];
  float fVar105;
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  float fVar111;
  float fVar112;
  float fVar113;
  undefined1 auVar110 [64];
  float t1;
  undefined4 uVar114;
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  float fVar122;
  float fVar123;
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  float fVar135;
  float fVar136;
  float fVar137;
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  vfloat4 b0;
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  vfloat4 b0_1;
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [32];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [32];
  vfloat4 a0_3;
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [32];
  vfloat4 a0_2;
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar182 [16];
  undefined1 auVar191 [32];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  float fVar199;
  float fVar200;
  float fVar210;
  float fVar212;
  float fVar214;
  undefined1 auVar201 [16];
  float fVar211;
  float fVar213;
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  float fVar215;
  float fVar223;
  float fVar224;
  float fVar225;
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  vfloat4 a0;
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [32];
  vfloat4 a0_1;
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [32];
  undefined1 auVar241 [64];
  undefined1 auVar242 [64];
  undefined1 auVar243 [64];
  undefined1 auVar244 [64];
  undefined1 auVar245 [64];
  undefined1 in_ZMM29 [64];
  undefined1 auVar246 [64];
  undefined1 auVar247 [64];
  undefined1 auVar248 [64];
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  vfloat_impl<4> p00;
  vfloat_impl<4> p03;
  uint mask_stack [4];
  RTCFilterFunctionNArguments args;
  BBox1f cu_stack [4];
  vint<16> mask;
  BBox1f cv_stack [4];
  float local_610;
  float fStack_60c;
  float fStack_608;
  float fStack_604;
  uint auStack_600 [4];
  RTCFilterFunctionNArguments local_5f0;
  undefined1 local_5c0 [8];
  float fStack_5b8;
  float fStack_5b4;
  undefined1 local_5b0 [16];
  undefined1 local_5a0 [16];
  undefined1 local_590 [16];
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  undefined1 local_570 [8];
  float fStack_568;
  float fStack_564;
  undefined1 local_560 [16];
  undefined1 local_550 [16];
  undefined1 local_540 [8];
  float fStack_538;
  float fStack_534;
  undefined1 local_530 [16];
  undefined1 local_520 [8];
  float fStack_518;
  float fStack_514;
  undefined1 local_510 [16];
  undefined1 local_500 [16];
  undefined1 local_4f0 [16];
  undefined1 local_4e0 [16];
  undefined1 local_4d0 [16];
  undefined1 local_4c0 [16];
  undefined1 local_4b0 [16];
  undefined1 local_4a0 [16];
  undefined1 local_490 [16];
  undefined1 local_480 [16];
  undefined1 local_470 [16];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined8 uStack_420;
  undefined1 local_400 [64];
  undefined1 local_3c0 [32];
  ulong auStack_3a0 [4];
  undefined1 local_380 [64];
  undefined1 local_340 [64];
  undefined1 local_300 [64];
  RTCHitN local_2c0 [64];
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  undefined1 local_1c0 [64];
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 uStack_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined1 local_140 [64];
  undefined1 local_100 [64];
  undefined1 local_c0 [64];
  ulong uVar33;
  undefined1 auVar92 [64];
  undefined1 auVar94 [64];
  undefined1 auVar96 [64];
  undefined1 auVar98 [64];
  undefined1 auVar100 [64];
  undefined1 auVar102 [64];
  undefined1 auVar235 [32];
  
  PVar7 = prim[1];
  uVar35 = (ulong)(byte)PVar7;
  fVar123 = *(float *)(prim + uVar35 * 0x19 + 0x12);
  auVar42 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x10);
  auVar42 = vinsertps_avx(auVar42,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x20);
  auVar54 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x100)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x140)),0x10);
  auVar45 = vinsertps_avx(auVar54,ZEXT416(*(uint *)(ray + k * 4 + 0x180)),0x20);
  auVar43 = vsubps_avx(auVar42,*(undefined1 (*) [16])(prim + uVar35 * 0x19 + 6));
  fVar122 = fVar123 * auVar43._0_4_;
  fVar105 = fVar123 * auVar45._0_4_;
  auVar42._8_8_ = 0;
  auVar42._0_8_ = *(ulong *)(prim + uVar35 * 4 + 6);
  auVar72 = vpmovsxbd_avx2(auVar42);
  auVar54._8_8_ = 0;
  auVar54._0_8_ = *(ulong *)(prim + uVar35 * 5 + 6);
  auVar70 = vpmovsxbd_avx2(auVar54);
  auVar72 = vcvtdq2ps_avx(auVar72);
  auVar70 = vcvtdq2ps_avx(auVar70);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = *(ulong *)(prim + uVar35 * 6 + 6);
  auVar73 = vpmovsxbd_avx2(auVar4);
  auVar73 = vcvtdq2ps_avx(auVar73);
  auVar53._8_8_ = 0;
  auVar53._0_8_ = *(ulong *)(prim + uVar35 * 0xb + 6);
  auVar83 = vpmovsxbd_avx2(auVar53);
  auVar52._8_8_ = 0;
  auVar52._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar7 * 0xc) + 6);
  auVar77 = vpmovsxbd_avx2(auVar52);
  auVar83 = vcvtdq2ps_avx(auVar83);
  auVar84 = vcvtdq2ps_avx(auVar77);
  auVar51._8_8_ = 0;
  auVar51._0_8_ = *(ulong *)(prim + (uint)(byte)PVar7 * 0xc + uVar35 + 6);
  auVar71 = vpmovsxbd_avx2(auVar51);
  auVar71 = vcvtdq2ps_avx(auVar71);
  uVar34 = (ulong)(uint)((int)(uVar35 * 9) * 2);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(ulong *)(prim + uVar34 + 6);
  auVar74 = vpmovsxbd_avx2(auVar5);
  auVar74 = vcvtdq2ps_avx(auVar74);
  auVar50._8_8_ = 0;
  auVar50._0_8_ = *(ulong *)(prim + uVar34 + uVar35 + 6);
  auVar75 = vpmovsxbd_avx2(auVar50);
  auVar75 = vcvtdq2ps_avx(auVar75);
  uVar27 = (ulong)(uint)((int)(uVar35 * 5) << 2);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + uVar27 + 6);
  auVar69 = vpmovsxbd_avx2(auVar6);
  auVar76 = vcvtdq2ps_avx(auVar69);
  auVar145._4_4_ = fVar105;
  auVar145._0_4_ = fVar105;
  auVar145._8_4_ = fVar105;
  auVar145._12_4_ = fVar105;
  auVar145._16_4_ = fVar105;
  auVar145._20_4_ = fVar105;
  auVar145._24_4_ = fVar105;
  auVar145._28_4_ = fVar105;
  auVar240._8_4_ = 1;
  auVar240._0_8_ = 0x100000001;
  auVar240._12_4_ = 1;
  auVar240._16_4_ = 1;
  auVar240._20_4_ = 1;
  auVar240._24_4_ = 1;
  auVar240._28_4_ = 1;
  auVar67 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar79 = ZEXT1632(CONCAT412(fVar123 * auVar45._12_4_,
                               CONCAT48(fVar123 * auVar45._8_4_,
                                        CONCAT44(fVar123 * auVar45._4_4_,fVar105))));
  auVar78 = vpermps_avx2(auVar240,auVar79);
  auVar68 = vpermps_avx512vl(auVar67,auVar79);
  fVar105 = auVar68._0_4_;
  fVar200 = auVar68._4_4_;
  auVar79._4_4_ = fVar200 * auVar73._4_4_;
  auVar79._0_4_ = fVar105 * auVar73._0_4_;
  fVar211 = auVar68._8_4_;
  auVar79._8_4_ = fVar211 * auVar73._8_4_;
  fVar213 = auVar68._12_4_;
  auVar79._12_4_ = fVar213 * auVar73._12_4_;
  fVar111 = auVar68._16_4_;
  auVar79._16_4_ = fVar111 * auVar73._16_4_;
  fVar112 = auVar68._20_4_;
  auVar79._20_4_ = fVar112 * auVar73._20_4_;
  fVar113 = auVar68._24_4_;
  auVar79._24_4_ = fVar113 * auVar73._24_4_;
  auVar79._28_4_ = auVar77._28_4_;
  auVar77._4_4_ = auVar71._4_4_ * fVar200;
  auVar77._0_4_ = auVar71._0_4_ * fVar105;
  auVar77._8_4_ = auVar71._8_4_ * fVar211;
  auVar77._12_4_ = auVar71._12_4_ * fVar213;
  auVar77._16_4_ = auVar71._16_4_ * fVar111;
  auVar77._20_4_ = auVar71._20_4_ * fVar112;
  auVar77._24_4_ = auVar71._24_4_ * fVar113;
  auVar77._28_4_ = auVar69._28_4_;
  auVar69._4_4_ = auVar76._4_4_ * fVar200;
  auVar69._0_4_ = auVar76._0_4_ * fVar105;
  auVar69._8_4_ = auVar76._8_4_ * fVar211;
  auVar69._12_4_ = auVar76._12_4_ * fVar213;
  auVar69._16_4_ = auVar76._16_4_ * fVar111;
  auVar69._20_4_ = auVar76._20_4_ * fVar112;
  auVar69._24_4_ = auVar76._24_4_ * fVar113;
  auVar69._28_4_ = auVar68._28_4_;
  auVar42 = vfmadd231ps_fma(auVar79,auVar78,auVar70);
  auVar54 = vfmadd231ps_fma(auVar77,auVar78,auVar84);
  auVar4 = vfmadd231ps_fma(auVar69,auVar75,auVar78);
  auVar42 = vfmadd231ps_fma(ZEXT1632(auVar42),auVar145,auVar72);
  auVar54 = vfmadd231ps_fma(ZEXT1632(auVar54),auVar145,auVar83);
  auVar4 = vfmadd231ps_fma(ZEXT1632(auVar4),auVar74,auVar145);
  auVar230._4_4_ = fVar122;
  auVar230._0_4_ = fVar122;
  auVar230._8_4_ = fVar122;
  auVar230._12_4_ = fVar122;
  auVar230._16_4_ = fVar122;
  auVar230._20_4_ = fVar122;
  auVar230._24_4_ = fVar122;
  auVar230._28_4_ = fVar122;
  auVar69 = ZEXT1632(CONCAT412(fVar123 * auVar43._12_4_,
                               CONCAT48(fVar123 * auVar43._8_4_,
                                        CONCAT44(fVar123 * auVar43._4_4_,fVar122))));
  auVar77 = vpermps_avx2(auVar240,auVar69);
  auVar69 = vpermps_avx512vl(auVar67,auVar69);
  fVar123 = auVar69._0_4_;
  fVar105 = auVar69._4_4_;
  auVar78._4_4_ = fVar105 * auVar73._4_4_;
  auVar78._0_4_ = fVar123 * auVar73._0_4_;
  fVar200 = auVar69._8_4_;
  auVar78._8_4_ = fVar200 * auVar73._8_4_;
  fVar211 = auVar69._12_4_;
  auVar78._12_4_ = fVar211 * auVar73._12_4_;
  fVar213 = auVar69._16_4_;
  auVar78._16_4_ = fVar213 * auVar73._16_4_;
  fVar111 = auVar69._20_4_;
  auVar78._20_4_ = fVar111 * auVar73._20_4_;
  fVar112 = auVar69._24_4_;
  auVar78._24_4_ = fVar112 * auVar73._24_4_;
  auVar78._28_4_ = 1;
  auVar67._4_4_ = auVar71._4_4_ * fVar105;
  auVar67._0_4_ = auVar71._0_4_ * fVar123;
  auVar67._8_4_ = auVar71._8_4_ * fVar200;
  auVar67._12_4_ = auVar71._12_4_ * fVar211;
  auVar67._16_4_ = auVar71._16_4_ * fVar213;
  auVar67._20_4_ = auVar71._20_4_ * fVar111;
  auVar67._24_4_ = auVar71._24_4_ * fVar112;
  auVar67._28_4_ = auVar73._28_4_;
  auVar71._4_4_ = auVar76._4_4_ * fVar105;
  auVar71._0_4_ = auVar76._0_4_ * fVar123;
  auVar71._8_4_ = auVar76._8_4_ * fVar200;
  auVar71._12_4_ = auVar76._12_4_ * fVar211;
  auVar71._16_4_ = auVar76._16_4_ * fVar213;
  auVar71._20_4_ = auVar76._20_4_ * fVar111;
  auVar71._24_4_ = auVar76._24_4_ * fVar112;
  auVar71._28_4_ = auVar69._28_4_;
  auVar53 = vfmadd231ps_fma(auVar78,auVar77,auVar70);
  auVar52 = vfmadd231ps_fma(auVar67,auVar77,auVar84);
  auVar51 = vfmadd231ps_fma(auVar71,auVar77,auVar75);
  auVar53 = vfmadd231ps_fma(ZEXT1632(auVar53),auVar230,auVar72);
  auVar52 = vfmadd231ps_fma(ZEXT1632(auVar52),auVar230,auVar83);
  auVar86._8_4_ = 0x7fffffff;
  auVar86._0_8_ = 0x7fffffff7fffffff;
  auVar86._12_4_ = 0x7fffffff;
  auVar86._16_4_ = 0x7fffffff;
  auVar86._20_4_ = 0x7fffffff;
  auVar86._24_4_ = 0x7fffffff;
  auVar86._28_4_ = 0x7fffffff;
  auVar51 = vfmadd231ps_fma(ZEXT1632(auVar51),auVar230,auVar74);
  auVar72 = vandps_avx(ZEXT1632(auVar42),auVar86);
  auVar133._8_4_ = 0x219392ef;
  auVar133._0_8_ = 0x219392ef219392ef;
  auVar133._12_4_ = 0x219392ef;
  auVar133._16_4_ = 0x219392ef;
  auVar133._20_4_ = 0x219392ef;
  auVar133._24_4_ = 0x219392ef;
  auVar133._28_4_ = 0x219392ef;
  uVar34 = vcmpps_avx512vl(auVar72,auVar133,1);
  bVar37 = (bool)((byte)uVar34 & 1);
  auVar68._0_4_ = (uint)bVar37 * 0x219392ef | (uint)!bVar37 * auVar42._0_4_;
  bVar37 = (bool)((byte)(uVar34 >> 1) & 1);
  auVar68._4_4_ = (uint)bVar37 * 0x219392ef | (uint)!bVar37 * auVar42._4_4_;
  bVar37 = (bool)((byte)(uVar34 >> 2) & 1);
  auVar68._8_4_ = (uint)bVar37 * 0x219392ef | (uint)!bVar37 * auVar42._8_4_;
  bVar37 = (bool)((byte)(uVar34 >> 3) & 1);
  auVar68._12_4_ = (uint)bVar37 * 0x219392ef | (uint)!bVar37 * auVar42._12_4_;
  auVar68._16_4_ = (uint)((byte)(uVar34 >> 4) & 1) * 0x219392ef;
  auVar68._20_4_ = (uint)((byte)(uVar34 >> 5) & 1) * 0x219392ef;
  auVar68._24_4_ = (uint)((byte)(uVar34 >> 6) & 1) * 0x219392ef;
  auVar68._28_4_ = (uint)(byte)(uVar34 >> 7) * 0x219392ef;
  auVar72 = vandps_avx(ZEXT1632(auVar54),auVar86);
  uVar34 = vcmpps_avx512vl(auVar72,auVar133,1);
  bVar37 = (bool)((byte)uVar34 & 1);
  auVar80._0_4_ = (uint)bVar37 * 0x219392ef | (uint)!bVar37 * auVar54._0_4_;
  bVar37 = (bool)((byte)(uVar34 >> 1) & 1);
  auVar80._4_4_ = (uint)bVar37 * 0x219392ef | (uint)!bVar37 * auVar54._4_4_;
  bVar37 = (bool)((byte)(uVar34 >> 2) & 1);
  auVar80._8_4_ = (uint)bVar37 * 0x219392ef | (uint)!bVar37 * auVar54._8_4_;
  bVar37 = (bool)((byte)(uVar34 >> 3) & 1);
  auVar80._12_4_ = (uint)bVar37 * 0x219392ef | (uint)!bVar37 * auVar54._12_4_;
  auVar80._16_4_ = (uint)((byte)(uVar34 >> 4) & 1) * 0x219392ef;
  auVar80._20_4_ = (uint)((byte)(uVar34 >> 5) & 1) * 0x219392ef;
  auVar80._24_4_ = (uint)((byte)(uVar34 >> 6) & 1) * 0x219392ef;
  auVar80._28_4_ = (uint)(byte)(uVar34 >> 7) * 0x219392ef;
  auVar72 = vandps_avx(ZEXT1632(auVar4),auVar86);
  uVar34 = vcmpps_avx512vl(auVar72,auVar133,1);
  bVar37 = (bool)((byte)uVar34 & 1);
  auVar72._0_4_ = (uint)bVar37 * 0x219392ef | (uint)!bVar37 * auVar4._0_4_;
  bVar37 = (bool)((byte)(uVar34 >> 1) & 1);
  auVar72._4_4_ = (uint)bVar37 * 0x219392ef | (uint)!bVar37 * auVar4._4_4_;
  bVar37 = (bool)((byte)(uVar34 >> 2) & 1);
  auVar72._8_4_ = (uint)bVar37 * 0x219392ef | (uint)!bVar37 * auVar4._8_4_;
  bVar37 = (bool)((byte)(uVar34 >> 3) & 1);
  auVar72._12_4_ = (uint)bVar37 * 0x219392ef | (uint)!bVar37 * auVar4._12_4_;
  auVar72._16_4_ = (uint)((byte)(uVar34 >> 4) & 1) * 0x219392ef;
  auVar72._20_4_ = (uint)((byte)(uVar34 >> 5) & 1) * 0x219392ef;
  auVar72._24_4_ = (uint)((byte)(uVar34 >> 6) & 1) * 0x219392ef;
  auVar72._28_4_ = (uint)(byte)(uVar34 >> 7) * 0x219392ef;
  auVar70 = vrcp14ps_avx512vl(auVar68);
  auVar87._8_4_ = 0x3f800000;
  auVar87._0_8_ = 0x3f8000003f800000;
  auVar87._12_4_ = 0x3f800000;
  auVar87._16_4_ = 0x3f800000;
  auVar87._20_4_ = 0x3f800000;
  auVar87._24_4_ = 0x3f800000;
  auVar87._28_4_ = 0x3f800000;
  auVar42 = vfnmadd213ps_fma(auVar68,auVar70,auVar87);
  auVar42 = vfmadd132ps_fma(ZEXT1632(auVar42),auVar70,auVar70);
  auVar70 = vrcp14ps_avx512vl(auVar80);
  auVar54 = vfnmadd213ps_fma(auVar80,auVar70,auVar87);
  auVar54 = vfmadd132ps_fma(ZEXT1632(auVar54),auVar70,auVar70);
  auVar70 = vrcp14ps_avx512vl(auVar72);
  auVar4 = vfnmadd213ps_fma(auVar72,auVar70,auVar87);
  auVar4 = vfmadd132ps_fma(ZEXT1632(auVar4),auVar70,auVar70);
  auVar72 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar35 * 7 + 6));
  auVar72 = vcvtdq2ps_avx(auVar72);
  auVar72 = vsubps_avx(auVar72,ZEXT1632(auVar53));
  auVar74._4_4_ = auVar42._4_4_ * auVar72._4_4_;
  auVar74._0_4_ = auVar42._0_4_ * auVar72._0_4_;
  auVar74._8_4_ = auVar42._8_4_ * auVar72._8_4_;
  auVar74._12_4_ = auVar42._12_4_ * auVar72._12_4_;
  auVar74._16_4_ = auVar72._16_4_ * 0.0;
  auVar74._20_4_ = auVar72._20_4_ * 0.0;
  auVar74._24_4_ = auVar72._24_4_ * 0.0;
  auVar74._28_4_ = auVar72._28_4_;
  auVar72 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar35 * 9 + 6));
  auVar72 = vcvtdq2ps_avx(auVar72);
  auVar72 = vsubps_avx(auVar72,ZEXT1632(auVar53));
  auVar71 = vpbroadcastd_avx512vl();
  auVar70 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar7 * 0x10 + 6));
  auVar85._0_4_ = auVar42._0_4_ * auVar72._0_4_;
  auVar85._4_4_ = auVar42._4_4_ * auVar72._4_4_;
  auVar85._8_4_ = auVar42._8_4_ * auVar72._8_4_;
  auVar85._12_4_ = auVar42._12_4_ * auVar72._12_4_;
  auVar85._16_4_ = auVar72._16_4_ * 0.0;
  auVar85._20_4_ = auVar72._20_4_ * 0.0;
  auVar85._24_4_ = auVar72._24_4_ * 0.0;
  auVar85._28_4_ = 0;
  auVar72 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                            (prim + (ulong)(byte)PVar7 * 0x10 + uVar35 * -2 + 6));
  auVar72 = vcvtdq2ps_avx(auVar72);
  auVar72 = vsubps_avx(auVar72,ZEXT1632(auVar52));
  auVar75._4_4_ = auVar54._4_4_ * auVar72._4_4_;
  auVar75._0_4_ = auVar54._0_4_ * auVar72._0_4_;
  auVar75._8_4_ = auVar54._8_4_ * auVar72._8_4_;
  auVar75._12_4_ = auVar54._12_4_ * auVar72._12_4_;
  auVar75._16_4_ = auVar72._16_4_ * 0.0;
  auVar75._20_4_ = auVar72._20_4_ * 0.0;
  auVar75._24_4_ = auVar72._24_4_ * 0.0;
  auVar75._28_4_ = auVar72._28_4_;
  auVar72 = vcvtdq2ps_avx(auVar70);
  auVar72 = vsubps_avx(auVar72,ZEXT1632(auVar52));
  auVar82._0_4_ = auVar54._0_4_ * auVar72._0_4_;
  auVar82._4_4_ = auVar54._4_4_ * auVar72._4_4_;
  auVar82._8_4_ = auVar54._8_4_ * auVar72._8_4_;
  auVar82._12_4_ = auVar54._12_4_ * auVar72._12_4_;
  auVar82._16_4_ = auVar72._16_4_ * 0.0;
  auVar82._20_4_ = auVar72._20_4_ * 0.0;
  auVar82._24_4_ = auVar72._24_4_ * 0.0;
  auVar82._28_4_ = 0;
  auVar72 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar27 + uVar35 + 6));
  auVar72 = vcvtdq2ps_avx(auVar72);
  auVar72 = vsubps_avx(auVar72,ZEXT1632(auVar51));
  auVar76._4_4_ = auVar72._4_4_ * auVar4._4_4_;
  auVar76._0_4_ = auVar72._0_4_ * auVar4._0_4_;
  auVar76._8_4_ = auVar72._8_4_ * auVar4._8_4_;
  auVar76._12_4_ = auVar72._12_4_ * auVar4._12_4_;
  auVar76._16_4_ = auVar72._16_4_ * 0.0;
  auVar76._20_4_ = auVar72._20_4_ * 0.0;
  auVar76._24_4_ = auVar72._24_4_ * 0.0;
  auVar76._28_4_ = auVar72._28_4_;
  auVar72 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar35 * 0x17 + 6));
  auVar72 = vcvtdq2ps_avx(auVar72);
  auVar72 = vsubps_avx(auVar72,ZEXT1632(auVar51));
  auVar81._0_4_ = auVar4._0_4_ * auVar72._0_4_;
  auVar81._4_4_ = auVar4._4_4_ * auVar72._4_4_;
  auVar81._8_4_ = auVar4._8_4_ * auVar72._8_4_;
  auVar81._12_4_ = auVar4._12_4_ * auVar72._12_4_;
  auVar81._16_4_ = auVar72._16_4_ * 0.0;
  auVar81._20_4_ = auVar72._20_4_ * 0.0;
  auVar81._24_4_ = auVar72._24_4_ * 0.0;
  auVar81._28_4_ = 0;
  auVar72 = vpminsd_avx2(auVar74,auVar85);
  auVar70 = vpminsd_avx2(auVar75,auVar82);
  auVar72 = vmaxps_avx(auVar72,auVar70);
  auVar70 = vpminsd_avx2(auVar76,auVar81);
  uVar114 = *(undefined4 *)(ray + k * 4 + 0xc0);
  auVar73._4_4_ = uVar114;
  auVar73._0_4_ = uVar114;
  auVar73._8_4_ = uVar114;
  auVar73._12_4_ = uVar114;
  auVar73._16_4_ = uVar114;
  auVar73._20_4_ = uVar114;
  auVar73._24_4_ = uVar114;
  auVar73._28_4_ = uVar114;
  auVar70 = vmaxps_avx512vl(auVar70,auVar73);
  auVar72 = vmaxps_avx(auVar72,auVar70);
  auVar70._8_4_ = 0x3f7ffffa;
  auVar70._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar70._12_4_ = 0x3f7ffffa;
  auVar70._16_4_ = 0x3f7ffffa;
  auVar70._20_4_ = 0x3f7ffffa;
  auVar70._24_4_ = 0x3f7ffffa;
  auVar70._28_4_ = 0x3f7ffffa;
  local_3c0 = vmulps_avx512vl(auVar72,auVar70);
  auVar72 = vpmaxsd_avx2(auVar74,auVar85);
  auVar70 = vpmaxsd_avx2(auVar75,auVar82);
  auVar72 = vminps_avx(auVar72,auVar70);
  auVar70 = vpmaxsd_avx2(auVar76,auVar81);
  uVar114 = *(undefined4 *)(ray + k * 4 + 0x200);
  auVar83._4_4_ = uVar114;
  auVar83._0_4_ = uVar114;
  auVar83._8_4_ = uVar114;
  auVar83._12_4_ = uVar114;
  auVar83._16_4_ = uVar114;
  auVar83._20_4_ = uVar114;
  auVar83._24_4_ = uVar114;
  auVar83._28_4_ = uVar114;
  auVar70 = vminps_avx512vl(auVar70,auVar83);
  auVar72 = vminps_avx(auVar72,auVar70);
  auVar84._8_4_ = 0x3f800003;
  auVar84._0_8_ = 0x3f8000033f800003;
  auVar84._12_4_ = 0x3f800003;
  auVar84._16_4_ = 0x3f800003;
  auVar84._20_4_ = 0x3f800003;
  auVar84._24_4_ = 0x3f800003;
  auVar84._28_4_ = 0x3f800003;
  auVar72 = vmulps_avx512vl(auVar72,auVar84);
  uVar14 = vpcmpgtd_avx512vl(auVar71,_DAT_01fe9900);
  uVar13 = vcmpps_avx512vl(local_3c0,auVar72,2);
  if ((byte)((byte)uVar13 & (byte)uVar14) == 0) {
    return false;
  }
  uVar34 = (ulong)(byte)((byte)uVar13 & (byte)uVar14);
  auVar42 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar248 = ZEXT1664(auVar42);
  auVar110 = vpmovm2d_avx512dq((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_380 = vmovdqa64_avx512f(auVar110);
  auVar42 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
  auVar110 = ZEXT1664(auVar42);
  auVar42 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar241 = ZEXT1664(auVar42);
  auVar247 = ZEXT464(0x3f800000);
  auVar42 = vxorps_avx512vl(in_ZMM29._0_16_,in_ZMM29._0_16_);
  auVar246 = ZEXT1664(auVar42);
LAB_01d3d6bc:
  lVar30 = 0;
  for (uVar27 = uVar34; (uVar27 & 1) == 0; uVar27 = uVar27 >> 1 | 0x8000000000000000) {
    lVar30 = lVar30 + 1;
  }
  uVar36 = *(uint *)(prim + 2);
  pGVar9 = (context->scene->geometries).items[uVar36].ptr;
  uVar27 = (ulong)*(uint *)(*(long *)&pGVar9->field_0x58 +
                           pGVar9[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)*(uint *)(prim + lVar30 * 4 + 6));
  p_Var10 = pGVar9[1].intersectionFilterN;
  pvVar11 = pGVar9[2].userPtr;
  _Var12 = pGVar9[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar42 = *(undefined1 (*) [16])(_Var12 + uVar27 * (long)pvVar11);
  auVar54 = *(undefined1 (*) [16])(_Var12 + (uVar27 + 1) * (long)pvVar11);
  auVar4 = *(undefined1 (*) [16])(_Var12 + (uVar27 + 2) * (long)pvVar11);
  auVar53 = *(undefined1 (*) [16])(_Var12 + (long)pvVar11 * (uVar27 + 3));
  lVar30 = *(long *)&pGVar9[1].time_range.upper;
  auVar52 = *(undefined1 (*) [16])(lVar30 + (long)p_Var10 * uVar27);
  auVar51 = *(undefined1 (*) [16])(lVar30 + (long)p_Var10 * (uVar27 + 1));
  auVar5 = *(undefined1 (*) [16])(lVar30 + (long)p_Var10 * (uVar27 + 2));
  uVar34 = uVar34 - 1 & uVar34;
  auVar50 = *(undefined1 (*) [16])(lVar30 + (long)p_Var10 * (uVar27 + 3));
  if (uVar34 != 0) {
    uVar35 = uVar34 - 1 & uVar34;
    for (uVar27 = uVar34; (uVar27 & 1) == 0; uVar27 = uVar27 >> 1 | 0x8000000000000000) {
    }
    if (uVar35 != 0) {
      for (; (uVar35 & 1) == 0; uVar35 = uVar35 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar6 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x1c
                        );
  auVar6 = vinsertps_avx(auVar6,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x28);
  auVar116 = auVar248._0_16_;
  auVar43 = vmulps_avx512vl(auVar50,auVar116);
  auVar45 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar5,auVar43);
  auVar44._0_4_ = auVar51._0_4_ + auVar45._0_4_;
  auVar44._4_4_ = auVar51._4_4_ + auVar45._4_4_;
  auVar44._8_4_ = auVar51._8_4_ + auVar45._8_4_;
  auVar44._12_4_ = auVar51._12_4_ + auVar45._12_4_;
  auVar44 = vfmadd231ps_avx512vl(auVar44,auVar52,auVar116);
  auVar55 = ZEXT816(0) << 0x40;
  auVar48._0_4_ = auVar50._0_4_ * 0.0;
  auVar48._4_4_ = auVar50._4_4_ * 0.0;
  auVar48._8_4_ = auVar50._8_4_ * 0.0;
  auVar48._12_4_ = auVar50._12_4_ * 0.0;
  auVar63 = auVar110._0_16_;
  auVar45 = vfmadd231ps_avx512vl(auVar48,auVar5,auVar63);
  auVar45 = vfmadd231ps_fma(auVar45,auVar51,auVar55);
  auVar46 = vfnmadd231ps_avx512vl(auVar45,auVar52,auVar63);
  auVar47 = vmulps_avx512vl(auVar53,auVar116);
  auVar45 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar4,auVar47);
  auVar226._0_4_ = auVar45._0_4_ + auVar54._0_4_;
  auVar226._4_4_ = auVar45._4_4_ + auVar54._4_4_;
  auVar226._8_4_ = auVar45._8_4_ + auVar54._8_4_;
  auVar226._12_4_ = auVar45._12_4_ + auVar54._12_4_;
  auVar48 = vfmadd231ps_avx512vl(auVar226,auVar42,auVar116);
  auVar231._0_4_ = auVar53._0_4_ * 0.0;
  auVar231._4_4_ = auVar53._4_4_ * 0.0;
  auVar231._8_4_ = auVar53._8_4_ * 0.0;
  auVar231._12_4_ = auVar53._12_4_ * 0.0;
  auVar45 = vfmadd231ps_avx512vl(auVar231,auVar4,auVar63);
  auVar45 = vfmadd231ps_fma(auVar45,auVar54,auVar55);
  auVar49 = vfnmadd231ps_avx512vl(auVar45,auVar42,auVar63);
  auVar58._0_4_ = auVar5._0_4_ + auVar43._0_4_;
  auVar58._4_4_ = auVar5._4_4_ + auVar43._4_4_;
  auVar58._8_4_ = auVar5._8_4_ + auVar43._8_4_;
  auVar58._12_4_ = auVar5._12_4_ + auVar43._12_4_;
  auVar45 = vfmadd231ps_fma(auVar58,auVar51,auVar55);
  auVar45 = vfmadd231ps_avx512vl(auVar45,auVar52,auVar116);
  auVar50 = vmulps_avx512vl(auVar50,auVar63);
  auVar5 = vfmadd231ps_fma(auVar50,auVar55,auVar5);
  auVar51 = vfnmadd231ps_avx512vl(auVar5,auVar63,auVar51);
  auVar5 = vfmadd231ps_fma(auVar51,auVar55,auVar52);
  auVar178._0_4_ = auVar47._0_4_ + auVar4._0_4_;
  auVar178._4_4_ = auVar47._4_4_ + auVar4._4_4_;
  auVar178._8_4_ = auVar47._8_4_ + auVar4._8_4_;
  auVar178._12_4_ = auVar47._12_4_ + auVar4._12_4_;
  auVar52 = vfmadd231ps_fma(auVar178,auVar54,auVar55);
  auVar52 = vfmadd231ps_avx512vl(auVar52,auVar42,auVar116);
  auVar53 = vmulps_avx512vl(auVar53,auVar63);
  auVar4 = vfmadd231ps_fma(auVar53,auVar55,auVar4);
  auVar54 = vfnmadd231ps_avx512vl(auVar4,auVar63,auVar54);
  auVar51 = vfmadd231ps_fma(auVar54,auVar55,auVar42);
  auVar42 = vshufps_avx(auVar46,auVar46,0xc9);
  auVar54 = vshufps_avx(auVar48,auVar48,0xc9);
  fVar213 = auVar46._0_4_;
  auVar57._0_4_ = fVar213 * auVar54._0_4_;
  fVar111 = auVar46._4_4_;
  auVar57._4_4_ = fVar111 * auVar54._4_4_;
  fVar112 = auVar46._8_4_;
  auVar57._8_4_ = fVar112 * auVar54._8_4_;
  fVar113 = auVar46._12_4_;
  auVar57._12_4_ = fVar113 * auVar54._12_4_;
  auVar54 = vfmsub231ps_fma(auVar57,auVar42,auVar48);
  auVar4 = vshufps_avx(auVar54,auVar54,0xc9);
  auVar54 = vshufps_avx(auVar49,auVar49,0xc9);
  auVar64._0_4_ = fVar213 * auVar54._0_4_;
  auVar64._4_4_ = fVar111 * auVar54._4_4_;
  auVar64._8_4_ = fVar112 * auVar54._8_4_;
  auVar64._12_4_ = fVar113 * auVar54._12_4_;
  auVar42 = vfmsub231ps_fma(auVar64,auVar42,auVar49);
  auVar53 = vshufps_avx(auVar42,auVar42,0xc9);
  auVar42 = vshufps_avx(auVar5,auVar5,0xc9);
  auVar54 = vshufps_avx(auVar52,auVar52,0xc9);
  fVar122 = auVar5._0_4_;
  auVar138._0_4_ = fVar122 * auVar54._0_4_;
  fVar135 = auVar5._4_4_;
  auVar138._4_4_ = fVar135 * auVar54._4_4_;
  fVar136 = auVar5._8_4_;
  auVar138._8_4_ = fVar136 * auVar54._8_4_;
  fVar137 = auVar5._12_4_;
  auVar138._12_4_ = fVar137 * auVar54._12_4_;
  auVar54 = vfmsub231ps_fma(auVar138,auVar42,auVar52);
  auVar52 = vshufps_avx(auVar54,auVar54,0xc9);
  auVar54 = vshufps_avx(auVar51,auVar51,0xc9);
  auVar179._0_4_ = auVar54._0_4_ * fVar122;
  auVar179._4_4_ = auVar54._4_4_ * fVar135;
  auVar179._8_4_ = auVar54._8_4_ * fVar136;
  auVar179._12_4_ = auVar54._12_4_ * fVar137;
  auVar42 = vfmsub231ps_fma(auVar179,auVar42,auVar51);
  auVar51 = vshufps_avx(auVar42,auVar42,0xc9);
  auVar42 = vdpps_avx(auVar4,auVar4,0x7f);
  fVar105 = auVar42._0_4_;
  auVar180._4_12_ = ZEXT812(0) << 0x20;
  auVar180._0_4_ = fVar105;
  auVar54 = vrsqrt14ss_avx512f(auVar55,auVar180);
  auVar50 = vmulss_avx512f(auVar54,ZEXT416(0x3fc00000));
  auVar43 = vmulss_avx512f(auVar42,ZEXT416(0xbf000000));
  fVar123 = auVar54._0_4_;
  fVar123 = auVar50._0_4_ + auVar43._0_4_ * fVar123 * fVar123 * fVar123;
  fVar215 = fVar123 * auVar4._0_4_;
  fVar223 = fVar123 * auVar4._4_4_;
  fVar224 = fVar123 * auVar4._8_4_;
  fVar225 = fVar123 * auVar4._12_4_;
  auVar54 = vdpps_avx(auVar4,auVar53,0x7f);
  auVar192._0_4_ = auVar53._0_4_ * fVar105;
  auVar192._4_4_ = auVar53._4_4_ * fVar105;
  auVar192._8_4_ = auVar53._8_4_ * fVar105;
  auVar192._12_4_ = auVar53._12_4_ * fVar105;
  fVar105 = auVar54._0_4_;
  auVar157._0_4_ = fVar105 * auVar4._0_4_;
  auVar157._4_4_ = fVar105 * auVar4._4_4_;
  auVar157._8_4_ = fVar105 * auVar4._8_4_;
  auVar157._12_4_ = fVar105 * auVar4._12_4_;
  auVar4 = vsubps_avx(auVar192,auVar157);
  auVar54 = vrcp14ss_avx512f(auVar55,auVar180);
  auVar42 = vfnmadd213ss_avx512f(auVar42,auVar54,ZEXT416(0x40000000));
  fVar200 = auVar54._0_4_ * auVar42._0_4_;
  auVar42 = vdpps_avx(auVar52,auVar52,0x7f);
  fVar211 = auVar42._0_4_;
  auVar171._4_12_ = ZEXT812(0) << 0x20;
  auVar171._0_4_ = fVar211;
  auVar54 = vrsqrt14ss_avx512f(auVar55,auVar171);
  auVar53 = vmulss_avx512f(auVar54,ZEXT416(0x3fc00000));
  auVar50 = vmulss_avx512f(auVar42,ZEXT416(0xbf000000));
  fVar105 = auVar54._0_4_;
  fVar105 = auVar53._0_4_ + auVar50._0_4_ * fVar105 * fVar105 * fVar105;
  fVar199 = fVar105 * auVar52._0_4_;
  fVar210 = fVar105 * auVar52._4_4_;
  fVar212 = fVar105 * auVar52._8_4_;
  fVar214 = fVar105 * auVar52._12_4_;
  auVar54 = vdpps_avx(auVar52,auVar51,0x7f);
  auVar65._0_4_ = fVar211 * auVar51._0_4_;
  auVar65._4_4_ = fVar211 * auVar51._4_4_;
  auVar65._8_4_ = fVar211 * auVar51._8_4_;
  auVar65._12_4_ = fVar211 * auVar51._12_4_;
  fVar211 = auVar54._0_4_;
  auVar56._0_4_ = fVar211 * auVar52._0_4_;
  auVar56._4_4_ = fVar211 * auVar52._4_4_;
  auVar56._8_4_ = fVar211 * auVar52._8_4_;
  auVar56._12_4_ = fVar211 * auVar52._12_4_;
  auVar53 = vsubps_avx(auVar65,auVar56);
  auVar54 = vrcp14ss_avx512f(auVar55,auVar171);
  auVar42 = vfnmadd213ss_avx512f(auVar42,auVar54,ZEXT416(0x40000000));
  fVar211 = auVar42._0_4_ * auVar54._0_4_;
  auVar42 = vshufps_avx(auVar44,auVar44,0xff);
  auVar172._0_4_ = fVar215 * auVar42._0_4_;
  auVar172._4_4_ = fVar223 * auVar42._4_4_;
  auVar172._8_4_ = fVar224 * auVar42._8_4_;
  auVar172._12_4_ = fVar225 * auVar42._12_4_;
  local_510 = vsubps_avx(auVar44,auVar172);
  auVar54 = vshufps_avx(auVar46,auVar46,0xff);
  auVar148._0_4_ = auVar54._0_4_ * fVar215 + auVar42._0_4_ * fVar123 * fVar200 * auVar4._0_4_;
  auVar148._4_4_ = auVar54._4_4_ * fVar223 + auVar42._4_4_ * fVar123 * fVar200 * auVar4._4_4_;
  auVar148._8_4_ = auVar54._8_4_ * fVar224 + auVar42._8_4_ * fVar123 * fVar200 * auVar4._8_4_;
  auVar148._12_4_ = auVar54._12_4_ * fVar225 + auVar42._12_4_ * fVar123 * fVar200 * auVar4._12_4_;
  auVar4 = vsubps_avx(auVar46,auVar148);
  local_520._0_4_ = auVar172._0_4_ + auVar44._0_4_;
  local_520._4_4_ = auVar172._4_4_ + auVar44._4_4_;
  fStack_518 = auVar172._8_4_ + auVar44._8_4_;
  fStack_514 = auVar172._12_4_ + auVar44._12_4_;
  auVar42 = vshufps_avx(auVar45,auVar45,0xff);
  auVar149._0_4_ = fVar199 * auVar42._0_4_;
  auVar149._4_4_ = fVar210 * auVar42._4_4_;
  auVar149._8_4_ = fVar212 * auVar42._8_4_;
  auVar149._12_4_ = fVar214 * auVar42._12_4_;
  local_530 = vsubps_avx(auVar45,auVar149);
  auVar54 = vshufps_avx(auVar5,auVar5,0xff);
  auVar49._0_4_ = auVar54._0_4_ * fVar199 + auVar42._0_4_ * fVar105 * auVar53._0_4_ * fVar211;
  auVar49._4_4_ = auVar54._4_4_ * fVar210 + auVar42._4_4_ * fVar105 * auVar53._4_4_ * fVar211;
  auVar49._8_4_ = auVar54._8_4_ * fVar212 + auVar42._8_4_ * fVar105 * auVar53._8_4_ * fVar211;
  auVar49._12_4_ = auVar54._12_4_ * fVar214 + auVar42._12_4_ * fVar105 * auVar53._12_4_ * fVar211;
  auVar42 = vsubps_avx(auVar5,auVar49);
  _local_540 = vaddps_avx512vl(auVar45,auVar149);
  auVar59._0_4_ = auVar4._0_4_ * 0.33333334;
  auVar59._4_4_ = auVar4._4_4_ * 0.33333334;
  auVar59._8_4_ = auVar4._8_4_ * 0.33333334;
  auVar59._12_4_ = auVar4._12_4_ * 0.33333334;
  local_550 = vaddps_avx512vl(local_510,auVar59);
  auVar62._0_4_ = auVar42._0_4_ * 0.33333334;
  auVar62._4_4_ = auVar42._4_4_ * 0.33333334;
  auVar62._8_4_ = auVar42._8_4_ * 0.33333334;
  auVar62._12_4_ = auVar42._12_4_ * 0.33333334;
  local_560 = vsubps_avx512vl(local_530,auVar62);
  auVar43._0_4_ = (fVar213 + auVar148._0_4_) * 0.33333334;
  auVar43._4_4_ = (fVar111 + auVar148._4_4_) * 0.33333334;
  auVar43._8_4_ = (fVar112 + auVar148._8_4_) * 0.33333334;
  auVar43._12_4_ = (fVar113 + auVar148._12_4_) * 0.33333334;
  _local_570 = vaddps_avx512vl(_local_520,auVar43);
  auVar46._0_4_ = (fVar122 + auVar49._0_4_) * 0.33333334;
  auVar46._4_4_ = (fVar135 + auVar49._4_4_) * 0.33333334;
  auVar46._8_4_ = (fVar136 + auVar49._8_4_) * 0.33333334;
  auVar46._12_4_ = (fVar137 + auVar49._12_4_) * 0.33333334;
  _local_580 = vsubps_avx512vl(_local_540,auVar46);
  local_490 = vsubps_avx(local_510,auVar6);
  uVar114 = local_490._0_4_;
  auVar63._4_4_ = uVar114;
  auVar63._0_4_ = uVar114;
  auVar63._8_4_ = uVar114;
  auVar63._12_4_ = uVar114;
  auVar42 = vshufps_avx(local_490,local_490,0x55);
  auVar54 = vshufps_avx(local_490,local_490,0xaa);
  aVar2 = pre->ray_space[k].vx.field_0;
  aVar3 = pre->ray_space[k].vy.field_0;
  fVar123 = pre->ray_space[k].vz.field_0.m128[0];
  fVar105 = pre->ray_space[k].vz.field_0.m128[1];
  fVar200 = pre->ray_space[k].vz.field_0.m128[2];
  fVar211 = pre->ray_space[k].vz.field_0.m128[3];
  auVar47._0_4_ = fVar123 * auVar54._0_4_;
  auVar47._4_4_ = fVar105 * auVar54._4_4_;
  auVar47._8_4_ = fVar200 * auVar54._8_4_;
  auVar47._12_4_ = fVar211 * auVar54._12_4_;
  auVar42 = vfmadd231ps_fma(auVar47,(undefined1  [16])aVar3,auVar42);
  auVar45 = vfmadd231ps_fma(auVar42,(undefined1  [16])aVar2,auVar63);
  local_4a0 = vsubps_avx512vl(local_550,auVar6);
  uVar114 = local_4a0._0_4_;
  auVar60._4_4_ = uVar114;
  auVar60._0_4_ = uVar114;
  auVar60._8_4_ = uVar114;
  auVar60._12_4_ = uVar114;
  auVar42 = vshufps_avx(local_4a0,local_4a0,0x55);
  auVar54 = vshufps_avx(local_4a0,local_4a0,0xaa);
  auVar66._0_4_ = fVar123 * auVar54._0_4_;
  auVar66._4_4_ = fVar105 * auVar54._4_4_;
  auVar66._8_4_ = fVar200 * auVar54._8_4_;
  auVar66._12_4_ = fVar211 * auVar54._12_4_;
  auVar42 = vfmadd231ps_fma(auVar66,(undefined1  [16])aVar3,auVar42);
  auVar43 = vfmadd231ps_fma(auVar42,(undefined1  [16])aVar2,auVar60);
  local_4b0 = vsubps_avx512vl(local_560,auVar6);
  uVar114 = local_4b0._0_4_;
  auVar158._4_4_ = uVar114;
  auVar158._0_4_ = uVar114;
  auVar158._8_4_ = uVar114;
  auVar158._12_4_ = uVar114;
  auVar42 = vshufps_avx(local_4b0,local_4b0,0x55);
  auVar54 = vshufps_avx(local_4b0,local_4b0,0xaa);
  auVar61._0_4_ = fVar123 * auVar54._0_4_;
  auVar61._4_4_ = fVar105 * auVar54._4_4_;
  auVar61._8_4_ = fVar200 * auVar54._8_4_;
  auVar61._12_4_ = fVar211 * auVar54._12_4_;
  auVar42 = vfmadd231ps_fma(auVar61,(undefined1  [16])aVar3,auVar42);
  auVar44 = vfmadd231ps_fma(auVar42,(undefined1  [16])aVar2,auVar158);
  local_4c0 = vsubps_avx(local_530,auVar6);
  uVar114 = local_4c0._0_4_;
  auVar159._4_4_ = uVar114;
  auVar159._0_4_ = uVar114;
  auVar159._8_4_ = uVar114;
  auVar159._12_4_ = uVar114;
  auVar42 = vshufps_avx(local_4c0,local_4c0,0x55);
  auVar54 = vshufps_avx(local_4c0,local_4c0,0xaa);
  auVar181._0_4_ = auVar54._0_4_ * fVar123;
  auVar181._4_4_ = auVar54._4_4_ * fVar105;
  auVar181._8_4_ = auVar54._8_4_ * fVar200;
  auVar181._12_4_ = auVar54._12_4_ * fVar211;
  auVar42 = vfmadd231ps_fma(auVar181,(undefined1  [16])aVar3,auVar42);
  auVar46 = vfmadd231ps_fma(auVar42,(undefined1  [16])aVar2,auVar159);
  local_4d0 = vsubps_avx(_local_520,auVar6);
  uVar114 = local_4d0._0_4_;
  auVar160._4_4_ = uVar114;
  auVar160._0_4_ = uVar114;
  auVar160._8_4_ = uVar114;
  auVar160._12_4_ = uVar114;
  auVar42 = vshufps_avx(local_4d0,local_4d0,0x55);
  auVar54 = vshufps_avx(local_4d0,local_4d0,0xaa);
  auVar193._0_4_ = auVar54._0_4_ * fVar123;
  auVar193._4_4_ = auVar54._4_4_ * fVar105;
  auVar193._8_4_ = auVar54._8_4_ * fVar200;
  auVar193._12_4_ = auVar54._12_4_ * fVar211;
  auVar42 = vfmadd231ps_fma(auVar193,(undefined1  [16])aVar3,auVar42);
  auVar47 = vfmadd231ps_fma(auVar42,(undefined1  [16])aVar2,auVar160);
  local_4e0 = vsubps_avx512vl(_local_570,auVar6);
  uVar114 = local_4e0._0_4_;
  auVar161._4_4_ = uVar114;
  auVar161._0_4_ = uVar114;
  auVar161._8_4_ = uVar114;
  auVar161._12_4_ = uVar114;
  auVar42 = vshufps_avx(local_4e0,local_4e0,0x55);
  auVar54 = vshufps_avx(local_4e0,local_4e0,0xaa);
  auVar201._0_4_ = auVar54._0_4_ * fVar123;
  auVar201._4_4_ = auVar54._4_4_ * fVar105;
  auVar201._8_4_ = auVar54._8_4_ * fVar200;
  auVar201._12_4_ = auVar54._12_4_ * fVar211;
  auVar42 = vfmadd231ps_fma(auVar201,(undefined1  [16])aVar3,auVar42);
  auVar48 = vfmadd231ps_fma(auVar42,(undefined1  [16])aVar2,auVar161);
  local_4f0 = vsubps_avx512vl(_local_580,auVar6);
  uVar114 = local_4f0._0_4_;
  auVar162._4_4_ = uVar114;
  auVar162._0_4_ = uVar114;
  auVar162._8_4_ = uVar114;
  auVar162._12_4_ = uVar114;
  auVar42 = vshufps_avx(local_4f0,local_4f0,0x55);
  auVar54 = vshufps_avx(local_4f0,local_4f0,0xaa);
  auVar216._0_4_ = auVar54._0_4_ * fVar123;
  auVar216._4_4_ = auVar54._4_4_ * fVar105;
  auVar216._8_4_ = auVar54._8_4_ * fVar200;
  auVar216._12_4_ = auVar54._12_4_ * fVar211;
  auVar42 = vfmadd231ps_fma(auVar216,(undefined1  [16])aVar3,auVar42);
  auVar49 = vfmadd231ps_fma(auVar42,(undefined1  [16])aVar2,auVar162);
  local_500 = vsubps_avx512vl(_local_540,auVar6);
  uVar114 = local_500._0_4_;
  auVar55._4_4_ = uVar114;
  auVar55._0_4_ = uVar114;
  auVar55._8_4_ = uVar114;
  auVar55._12_4_ = uVar114;
  auVar42 = vshufps_avx(local_500,local_500,0x55);
  auVar54 = vshufps_avx(local_500,local_500,0xaa);
  auVar150._0_4_ = auVar54._0_4_ * fVar123;
  auVar150._4_4_ = auVar54._4_4_ * fVar105;
  auVar150._8_4_ = auVar54._8_4_ * fVar200;
  auVar150._12_4_ = auVar54._12_4_ * fVar211;
  auVar42 = vfmadd231ps_fma(auVar150,(undefined1  [16])aVar3,auVar42);
  auVar6 = vfmadd231ps_fma(auVar42,(undefined1  [16])aVar2,auVar55);
  auVar4 = vmovlhps_avx(auVar45,auVar47);
  auVar51 = vmovlhps_avx512f(auVar43,auVar48);
  auVar5 = vmovlhps_avx512f(auVar44,auVar49);
  auVar50 = vmovlhps_avx512f(auVar46,auVar6);
  auVar42 = vminps_avx512vl(auVar4,auVar51);
  auVar53 = vmaxps_avx512vl(auVar4,auVar51);
  auVar54 = vminps_avx512vl(auVar5,auVar50);
  auVar54 = vminps_avx(auVar42,auVar54);
  auVar42 = vmaxps_avx512vl(auVar5,auVar50);
  auVar42 = vmaxps_avx(auVar53,auVar42);
  auVar53 = vshufpd_avx(auVar54,auVar54,3);
  auVar52 = vshufpd_avx(auVar42,auVar42,3);
  auVar54 = vminps_avx(auVar54,auVar53);
  auVar42 = vmaxps_avx(auVar42,auVar52);
  auVar54 = vandps_avx512vl(auVar54,auVar241._0_16_);
  auVar42 = vandps_avx512vl(auVar42,auVar241._0_16_);
  auVar42 = vmaxps_avx(auVar54,auVar42);
  auVar54 = vmovshdup_avx(auVar42);
  auVar42 = vmaxss_avx(auVar54,auVar42);
  fVar123 = auVar42._0_4_ * 9.536743e-07;
  auVar163._8_8_ = auVar45._0_8_;
  auVar163._0_8_ = auVar45._0_8_;
  auVar54 = vmovddup_avx512vl(auVar43);
  auVar53 = vmovddup_avx512vl(auVar44);
  auVar182._0_8_ = auVar46._0_8_;
  auVar182._8_8_ = auVar182._0_8_;
  local_440 = vbroadcastss_avx512vl(ZEXT416((uint)fVar123));
  auVar42 = vxorps_avx512vl(local_440._0_16_,auVar116);
  local_460 = vbroadcastss_avx512vl(auVar42);
  auVar110 = vpbroadcastd_avx512f();
  local_300 = vmovdqa64_avx512f(auVar110);
  bVar37 = false;
  uVar27 = 0;
  uVar1 = *(uint *)(ray + k * 4 + 0xc0);
  auVar89._0_16_ = vsubps_avx512vl(auVar51,auVar4);
  local_470 = vsubps_avx512vl(auVar5,auVar51);
  local_480 = vsubps_avx512vl(auVar50,auVar5);
  local_590 = vsubps_avx(_local_520,local_510);
  local_5a0 = vsubps_avx512vl(_local_570,local_550);
  local_5b0 = vsubps_avx512vl(_local_580,local_560);
  _local_5c0 = vsubps_avx512vl(_local_540,local_530);
  auVar110 = vpbroadcastd_avx512f();
  local_340 = vmovdqa64_avx512f(auVar110);
  auVar42 = ZEXT816(0x3f80000000000000);
  auVar104._32_32_ = auVar110._32_32_;
  auVar45 = auVar42;
LAB_01d3de27:
  do {
    auVar52 = vshufps_avx(auVar45,auVar45,0x50);
    auVar232._8_4_ = 0x3f800000;
    auVar232._0_8_ = 0x3f8000003f800000;
    auVar232._12_4_ = 0x3f800000;
    auVar235._16_4_ = 0x3f800000;
    auVar235._0_16_ = auVar232;
    auVar235._20_4_ = 0x3f800000;
    auVar235._24_4_ = 0x3f800000;
    auVar235._28_4_ = 0x3f800000;
    auVar43 = vsubps_avx(auVar232,auVar52);
    fVar105 = auVar52._0_4_;
    fVar111 = auVar47._0_4_;
    auVar130._0_4_ = fVar111 * fVar105;
    fVar200 = auVar52._4_4_;
    fVar112 = auVar47._4_4_;
    auVar130._4_4_ = fVar112 * fVar200;
    fVar211 = auVar52._8_4_;
    auVar130._8_4_ = fVar111 * fVar211;
    fVar213 = auVar52._12_4_;
    auVar130._12_4_ = fVar112 * fVar213;
    fVar113 = auVar48._0_4_;
    auVar139._0_4_ = fVar113 * fVar105;
    fVar122 = auVar48._4_4_;
    auVar139._4_4_ = fVar122 * fVar200;
    auVar139._8_4_ = fVar113 * fVar211;
    auVar139._12_4_ = fVar122 * fVar213;
    fVar135 = auVar49._0_4_;
    auVar151._0_4_ = fVar135 * fVar105;
    fVar136 = auVar49._4_4_;
    auVar151._4_4_ = fVar136 * fVar200;
    auVar151._8_4_ = fVar135 * fVar211;
    auVar151._12_4_ = fVar136 * fVar213;
    fVar137 = auVar6._0_4_;
    auVar116._0_4_ = fVar137 * fVar105;
    fVar199 = auVar6._4_4_;
    auVar116._4_4_ = fVar199 * fVar200;
    auVar116._8_4_ = fVar137 * fVar211;
    auVar116._12_4_ = fVar199 * fVar213;
    auVar44 = vfmadd231ps_fma(auVar130,auVar43,auVar163);
    auVar46 = vfmadd231ps_avx512vl(auVar139,auVar43,auVar54);
    auVar55 = vfmadd231ps_avx512vl(auVar151,auVar43,auVar53);
    auVar43 = vfmadd231ps_fma(auVar116,auVar182,auVar43);
    auVar52 = vmovshdup_avx(auVar42);
    fVar200 = auVar42._0_4_;
    fVar105 = (auVar52._0_4_ - fVar200) * 0.04761905;
    auVar177._4_4_ = fVar200;
    auVar177._0_4_ = fVar200;
    auVar177._8_4_ = fVar200;
    auVar177._12_4_ = fVar200;
    auVar177._16_4_ = fVar200;
    auVar177._20_4_ = fVar200;
    auVar177._24_4_ = fVar200;
    auVar177._28_4_ = fVar200;
    auVar128._0_8_ = auVar52._0_8_;
    auVar128._8_8_ = auVar128._0_8_;
    auVar128._16_8_ = auVar128._0_8_;
    auVar128._24_8_ = auVar128._0_8_;
    auVar72 = vsubps_avx(auVar128,auVar177);
    uVar114 = auVar44._0_4_;
    auVar129._4_4_ = uVar114;
    auVar129._0_4_ = uVar114;
    auVar129._8_4_ = uVar114;
    auVar129._12_4_ = uVar114;
    auVar129._16_4_ = uVar114;
    auVar129._20_4_ = uVar114;
    auVar129._24_4_ = uVar114;
    auVar129._28_4_ = uVar114;
    auVar196._8_4_ = 1;
    auVar196._0_8_ = 0x100000001;
    auVar196._12_4_ = 1;
    auVar196._16_4_ = 1;
    auVar196._20_4_ = 1;
    auVar196._24_4_ = 1;
    auVar196._28_4_ = 1;
    auVar83 = ZEXT1632(auVar44);
    auVar70 = vpermps_avx2(auVar196,auVar83);
    auVar73 = vbroadcastss_avx512vl(auVar46);
    auVar84 = ZEXT1632(auVar46);
    auVar71 = vpermps_avx512vl(auVar196,auVar84);
    auVar74 = vbroadcastss_avx512vl(auVar55);
    auVar81 = ZEXT1632(auVar55);
    auVar75 = vpermps_avx512vl(auVar196,auVar81);
    auVar76 = vbroadcastss_avx512vl(auVar43);
    auVar80 = ZEXT1632(auVar43);
    auVar77 = vpermps_avx512vl(auVar196,auVar80);
    auVar197._4_4_ = fVar105;
    auVar197._0_4_ = fVar105;
    auVar197._8_4_ = fVar105;
    auVar197._12_4_ = fVar105;
    auVar197._16_4_ = fVar105;
    auVar197._20_4_ = fVar105;
    auVar197._24_4_ = fVar105;
    auVar197._28_4_ = fVar105;
    auVar69 = vbroadcastss_avx512vl(ZEXT416(2));
    auVar78 = vpermps_avx512vl(auVar69,auVar83);
    auVar170._8_4_ = 3;
    auVar170._0_8_ = 0x300000003;
    auVar170._12_4_ = 3;
    auVar170._16_4_ = 3;
    auVar170._20_4_ = 3;
    auVar170._24_4_ = 3;
    auVar170._28_4_ = 3;
    auVar79 = vpermps_avx512vl(auVar170,auVar83);
    auVar67 = vpermps_avx512vl(auVar69,auVar84);
    auVar83 = vpermps_avx2(auVar170,auVar84);
    auVar68 = vpermps_avx512vl(auVar69,auVar81);
    auVar84 = vpermps_avx2(auVar170,auVar81);
    auVar69 = vpermps_avx512vl(auVar69,auVar80);
    auVar80 = vpermps_avx512vl(auVar170,auVar80);
    auVar52 = vfmadd132ps_fma(auVar72,auVar177,_DAT_01faff20);
    auVar72 = vsubps_avx(auVar235,ZEXT1632(auVar52));
    auVar81 = vmulps_avx512vl(auVar73,ZEXT1632(auVar52));
    auVar85 = ZEXT1632(auVar52);
    auVar82 = vmulps_avx512vl(auVar71,auVar85);
    auVar43 = vfmadd231ps_fma(auVar81,auVar72,auVar129);
    auVar44 = vfmadd231ps_fma(auVar82,auVar72,auVar70);
    auVar81 = vmulps_avx512vl(auVar74,auVar85);
    auVar82 = vmulps_avx512vl(auVar75,auVar85);
    auVar73 = vfmadd231ps_avx512vl(auVar81,auVar72,auVar73);
    auVar71 = vfmadd231ps_avx512vl(auVar82,auVar72,auVar71);
    auVar81 = vmulps_avx512vl(auVar76,auVar85);
    auVar82 = ZEXT1632(auVar52);
    auVar77 = vmulps_avx512vl(auVar77,auVar82);
    auVar74 = vfmadd231ps_avx512vl(auVar81,auVar72,auVar74);
    auVar75 = vfmadd231ps_avx512vl(auVar77,auVar72,auVar75);
    fVar211 = auVar52._0_4_;
    fVar213 = auVar52._4_4_;
    auVar21._4_4_ = fVar213 * auVar73._4_4_;
    auVar21._0_4_ = fVar211 * auVar73._0_4_;
    fVar210 = auVar52._8_4_;
    auVar21._8_4_ = fVar210 * auVar73._8_4_;
    fVar212 = auVar52._12_4_;
    auVar21._12_4_ = fVar212 * auVar73._12_4_;
    auVar21._16_4_ = auVar73._16_4_ * 0.0;
    auVar21._20_4_ = auVar73._20_4_ * 0.0;
    auVar21._24_4_ = auVar73._24_4_ * 0.0;
    auVar21._28_4_ = fVar200;
    auVar22._4_4_ = fVar213 * auVar71._4_4_;
    auVar22._0_4_ = fVar211 * auVar71._0_4_;
    auVar22._8_4_ = fVar210 * auVar71._8_4_;
    auVar22._12_4_ = fVar212 * auVar71._12_4_;
    auVar22._16_4_ = auVar71._16_4_ * 0.0;
    auVar22._20_4_ = auVar71._20_4_ * 0.0;
    auVar22._24_4_ = auVar71._24_4_ * 0.0;
    auVar22._28_4_ = auVar70._28_4_;
    auVar43 = vfmadd231ps_fma(auVar21,auVar72,ZEXT1632(auVar43));
    auVar44 = vfmadd231ps_fma(auVar22,auVar72,ZEXT1632(auVar44));
    auVar120._0_4_ = fVar211 * auVar74._0_4_;
    auVar120._4_4_ = fVar213 * auVar74._4_4_;
    auVar120._8_4_ = fVar210 * auVar74._8_4_;
    auVar120._12_4_ = fVar212 * auVar74._12_4_;
    auVar120._16_4_ = auVar74._16_4_ * 0.0;
    auVar120._20_4_ = auVar74._20_4_ * 0.0;
    auVar120._24_4_ = auVar74._24_4_ * 0.0;
    auVar120._28_4_ = 0;
    auVar23._4_4_ = fVar213 * auVar75._4_4_;
    auVar23._0_4_ = fVar211 * auVar75._0_4_;
    auVar23._8_4_ = fVar210 * auVar75._8_4_;
    auVar23._12_4_ = fVar212 * auVar75._12_4_;
    auVar23._16_4_ = auVar75._16_4_ * 0.0;
    auVar23._20_4_ = auVar75._20_4_ * 0.0;
    auVar23._24_4_ = auVar75._24_4_ * 0.0;
    auVar23._28_4_ = auVar74._28_4_;
    auVar46 = vfmadd231ps_fma(auVar120,auVar72,auVar73);
    auVar55 = vfmadd231ps_fma(auVar23,auVar72,auVar71);
    auVar24._28_4_ = auVar71._28_4_;
    auVar24._0_28_ =
         ZEXT1628(CONCAT412(fVar212 * auVar55._12_4_,
                            CONCAT48(fVar210 * auVar55._8_4_,
                                     CONCAT44(fVar213 * auVar55._4_4_,fVar211 * auVar55._0_4_))));
    auVar63 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar212 * auVar46._12_4_,
                                                 CONCAT48(fVar210 * auVar46._8_4_,
                                                          CONCAT44(fVar213 * auVar46._4_4_,
                                                                   fVar211 * auVar46._0_4_)))),
                              auVar72,ZEXT1632(auVar43));
    auVar66 = vfmadd231ps_fma(auVar24,auVar72,ZEXT1632(auVar44));
    auVar70 = vsubps_avx(ZEXT1632(auVar46),ZEXT1632(auVar43));
    auVar73 = vsubps_avx(ZEXT1632(auVar55),ZEXT1632(auVar44));
    auVar71 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar70 = vmulps_avx512vl(auVar70,auVar71);
    auVar73 = vmulps_avx512vl(auVar73,auVar71);
    auVar191._0_4_ = fVar105 * auVar70._0_4_;
    auVar191._4_4_ = fVar105 * auVar70._4_4_;
    auVar191._8_4_ = fVar105 * auVar70._8_4_;
    auVar191._12_4_ = fVar105 * auVar70._12_4_;
    auVar191._16_4_ = fVar105 * auVar70._16_4_;
    auVar191._20_4_ = fVar105 * auVar70._20_4_;
    auVar191._24_4_ = fVar105 * auVar70._24_4_;
    auVar191._28_4_ = 0;
    auVar70 = vmulps_avx512vl(auVar197,auVar73);
    auVar44 = vxorps_avx512vl(auVar76._0_16_,auVar76._0_16_);
    auVar73 = vpermt2ps_avx512vl(ZEXT1632(auVar63),_DAT_01feed00,ZEXT1632(auVar44));
    auVar74 = vpermt2ps_avx512vl(ZEXT1632(auVar66),_DAT_01feed00,ZEXT1632(auVar44));
    auVar121._0_4_ = auVar191._0_4_ + auVar63._0_4_;
    auVar121._4_4_ = auVar191._4_4_ + auVar63._4_4_;
    auVar121._8_4_ = auVar191._8_4_ + auVar63._8_4_;
    auVar121._12_4_ = auVar191._12_4_ + auVar63._12_4_;
    auVar121._16_4_ = auVar191._16_4_ + 0.0;
    auVar121._20_4_ = auVar191._20_4_ + 0.0;
    auVar121._24_4_ = auVar191._24_4_ + 0.0;
    auVar121._28_4_ = 0;
    auVar85 = ZEXT1632(auVar44);
    auVar75 = vpermt2ps_avx512vl(auVar191,_DAT_01feed00,auVar85);
    auVar76 = vaddps_avx512vl(ZEXT1632(auVar66),auVar70);
    auVar77 = vpermt2ps_avx512vl(auVar70,_DAT_01feed00,auVar85);
    auVar70 = vsubps_avx(auVar73,auVar75);
    auVar75 = vsubps_avx512vl(auVar74,auVar77);
    auVar77 = vmulps_avx512vl(auVar67,auVar82);
    auVar81 = vmulps_avx512vl(auVar83,auVar82);
    auVar77 = vfmadd231ps_avx512vl(auVar77,auVar72,auVar78);
    auVar78 = vfmadd231ps_avx512vl(auVar81,auVar72,auVar79);
    auVar79 = vmulps_avx512vl(auVar68,auVar82);
    auVar81 = vmulps_avx512vl(auVar84,auVar82);
    auVar79 = vfmadd231ps_avx512vl(auVar79,auVar72,auVar67);
    auVar83 = vfmadd231ps_avx512vl(auVar81,auVar72,auVar83);
    auVar69 = vmulps_avx512vl(auVar69,auVar82);
    auVar67 = vmulps_avx512vl(auVar80,auVar82);
    auVar43 = vfmadd231ps_fma(auVar69,auVar72,auVar68);
    auVar69 = vfmadd231ps_avx512vl(auVar67,auVar72,auVar84);
    auVar67 = vmulps_avx512vl(auVar82,auVar79);
    auVar80 = ZEXT1632(auVar52);
    auVar68 = vmulps_avx512vl(auVar80,auVar83);
    auVar77 = vfmadd231ps_avx512vl(auVar67,auVar72,auVar77);
    auVar78 = vfmadd231ps_avx512vl(auVar68,auVar72,auVar78);
    auVar69 = vmulps_avx512vl(auVar80,auVar69);
    auVar79 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(fVar212 * auVar43._12_4_,
                                            CONCAT48(fVar210 * auVar43._8_4_,
                                                     CONCAT44(fVar213 * auVar43._4_4_,
                                                              fVar211 * auVar43._0_4_)))),auVar72,
                         auVar79);
    auVar83 = vfmadd231ps_avx512vl(auVar69,auVar72,auVar83);
    auVar25._4_4_ = fVar213 * auVar79._4_4_;
    auVar25._0_4_ = fVar211 * auVar79._0_4_;
    auVar25._8_4_ = fVar210 * auVar79._8_4_;
    auVar25._12_4_ = fVar212 * auVar79._12_4_;
    auVar25._16_4_ = auVar79._16_4_ * 0.0;
    auVar25._20_4_ = auVar79._20_4_ * 0.0;
    auVar25._24_4_ = auVar79._24_4_ * 0.0;
    auVar25._28_4_ = auVar84._28_4_;
    auVar84 = vmulps_avx512vl(auVar80,auVar83);
    auVar69 = vfmadd231ps_avx512vl(auVar25,auVar72,auVar77);
    auVar84 = vfmadd231ps_avx512vl(auVar84,auVar78,auVar72);
    auVar72 = vsubps_avx512vl(auVar79,auVar77);
    auVar83 = vsubps_avx512vl(auVar83,auVar78);
    auVar72 = vmulps_avx512vl(auVar72,auVar71);
    auVar83 = vmulps_avx512vl(auVar83,auVar71);
    fVar200 = fVar105 * auVar72._0_4_;
    fVar211 = fVar105 * auVar72._4_4_;
    auVar26._4_4_ = fVar211;
    auVar26._0_4_ = fVar200;
    fVar213 = fVar105 * auVar72._8_4_;
    auVar26._8_4_ = fVar213;
    fVar210 = fVar105 * auVar72._12_4_;
    auVar26._12_4_ = fVar210;
    fVar212 = fVar105 * auVar72._16_4_;
    auVar26._16_4_ = fVar212;
    fVar214 = fVar105 * auVar72._20_4_;
    auVar26._20_4_ = fVar214;
    fVar105 = fVar105 * auVar72._24_4_;
    auVar26._24_4_ = fVar105;
    auVar26._28_4_ = auVar72._28_4_;
    auVar83 = vmulps_avx512vl(auVar197,auVar83);
    auVar71 = vpermt2ps_avx512vl(auVar69,_DAT_01feed00,auVar85);
    auVar77 = vpermt2ps_avx512vl(auVar84,_DAT_01feed00,auVar85);
    auVar198._0_4_ = auVar69._0_4_ + fVar200;
    auVar198._4_4_ = auVar69._4_4_ + fVar211;
    auVar198._8_4_ = auVar69._8_4_ + fVar213;
    auVar198._12_4_ = auVar69._12_4_ + fVar210;
    auVar198._16_4_ = auVar69._16_4_ + fVar212;
    auVar198._20_4_ = auVar69._20_4_ + fVar214;
    auVar198._24_4_ = auVar69._24_4_ + fVar105;
    auVar198._28_4_ = auVar69._28_4_ + auVar72._28_4_;
    auVar72 = vpermt2ps_avx512vl(auVar26,_DAT_01feed00,ZEXT1632(auVar44));
    auVar78 = vaddps_avx512vl(auVar84,auVar83);
    auVar83 = vpermt2ps_avx512vl(auVar83,_DAT_01feed00,ZEXT1632(auVar44));
    auVar72 = vsubps_avx(auVar71,auVar72);
    auVar83 = vsubps_avx512vl(auVar77,auVar83);
    auVar133 = ZEXT1632(auVar63);
    auVar79 = vsubps_avx512vl(auVar69,auVar133);
    auVar145 = ZEXT1632(auVar66);
    auVar67 = vsubps_avx512vl(auVar84,auVar145);
    auVar68 = vsubps_avx512vl(auVar71,auVar73);
    auVar79 = vaddps_avx512vl(auVar79,auVar68);
    auVar68 = vsubps_avx512vl(auVar77,auVar74);
    auVar67 = vaddps_avx512vl(auVar67,auVar68);
    auVar68 = vmulps_avx512vl(auVar145,auVar79);
    auVar68 = vfnmadd231ps_avx512vl(auVar68,auVar133,auVar67);
    auVar80 = vmulps_avx512vl(auVar76,auVar79);
    auVar80 = vfnmadd231ps_avx512vl(auVar80,auVar121,auVar67);
    auVar81 = vmulps_avx512vl(auVar75,auVar79);
    auVar81 = vfnmadd231ps_avx512vl(auVar81,auVar70,auVar67);
    auVar82 = vmulps_avx512vl(auVar74,auVar79);
    auVar82 = vfnmadd231ps_avx512vl(auVar82,auVar73,auVar67);
    auVar85 = vmulps_avx512vl(auVar84,auVar79);
    auVar85 = vfnmadd231ps_avx512vl(auVar85,auVar69,auVar67);
    auVar86 = vmulps_avx512vl(auVar78,auVar79);
    auVar86 = vfnmadd231ps_avx512vl(auVar86,auVar198,auVar67);
    auVar87 = vmulps_avx512vl(auVar83,auVar79);
    auVar87 = vfnmadd231ps_avx512vl(auVar87,auVar72,auVar67);
    auVar79 = vmulps_avx512vl(auVar77,auVar79);
    auVar79 = vfnmadd231ps_avx512vl(auVar79,auVar71,auVar67);
    auVar67 = vminps_avx512vl(auVar68,auVar80);
    auVar68 = vmaxps_avx512vl(auVar68,auVar80);
    auVar80 = vminps_avx512vl(auVar81,auVar82);
    auVar67 = vminps_avx512vl(auVar67,auVar80);
    auVar80 = vmaxps_avx512vl(auVar81,auVar82);
    auVar68 = vmaxps_avx512vl(auVar68,auVar80);
    auVar80 = vminps_avx512vl(auVar85,auVar86);
    auVar81 = vmaxps_avx512vl(auVar85,auVar86);
    auVar82 = vminps_avx512vl(auVar87,auVar79);
    auVar80 = vminps_avx512vl(auVar80,auVar82);
    auVar67 = vminps_avx512vl(auVar67,auVar80);
    auVar79 = vmaxps_avx512vl(auVar87,auVar79);
    auVar79 = vmaxps_avx512vl(auVar81,auVar79);
    auVar79 = vmaxps_avx512vl(auVar68,auVar79);
    uVar13 = vcmpps_avx512vl(auVar67,local_440,2);
    uVar14 = vcmpps_avx512vl(auVar79,local_460,5);
    bVar31 = (byte)uVar13 & (byte)uVar14 & 0x7f;
    if (bVar31 != 0) {
      auVar79 = vsubps_avx512vl(auVar73,auVar133);
      auVar67 = vsubps_avx512vl(auVar74,auVar145);
      auVar68 = vsubps_avx512vl(auVar71,auVar69);
      auVar79 = vaddps_avx512vl(auVar79,auVar68);
      auVar68 = vsubps_avx512vl(auVar77,auVar84);
      auVar67 = vaddps_avx512vl(auVar67,auVar68);
      auVar68 = vmulps_avx512vl(auVar145,auVar79);
      auVar68 = vfnmadd231ps_avx512vl(auVar68,auVar67,auVar133);
      auVar76 = vmulps_avx512vl(auVar76,auVar79);
      auVar76 = vfnmadd213ps_avx512vl(auVar121,auVar67,auVar76);
      auVar75 = vmulps_avx512vl(auVar75,auVar79);
      auVar75 = vfnmadd213ps_avx512vl(auVar70,auVar67,auVar75);
      auVar70 = vmulps_avx512vl(auVar74,auVar79);
      auVar74 = vfnmadd231ps_avx512vl(auVar70,auVar67,auVar73);
      auVar70 = vmulps_avx512vl(auVar84,auVar79);
      auVar84 = vfnmadd231ps_avx512vl(auVar70,auVar67,auVar69);
      auVar70 = vmulps_avx512vl(auVar78,auVar79);
      auVar69 = vfnmadd213ps_avx512vl(auVar198,auVar67,auVar70);
      auVar70 = vmulps_avx512vl(auVar83,auVar79);
      auVar78 = vfnmadd213ps_avx512vl(auVar72,auVar67,auVar70);
      auVar72 = vmulps_avx512vl(auVar77,auVar79);
      auVar71 = vfnmadd231ps_avx512vl(auVar72,auVar71,auVar67);
      auVar70 = vminps_avx(auVar68,auVar76);
      auVar72 = vmaxps_avx(auVar68,auVar76);
      auVar73 = vminps_avx(auVar75,auVar74);
      auVar73 = vminps_avx(auVar70,auVar73);
      auVar70 = vmaxps_avx(auVar75,auVar74);
      auVar72 = vmaxps_avx(auVar72,auVar70);
      auVar83 = vminps_avx(auVar84,auVar69);
      auVar70 = vmaxps_avx(auVar84,auVar69);
      auVar84 = vminps_avx(auVar78,auVar71);
      auVar83 = vminps_avx(auVar83,auVar84);
      auVar83 = vminps_avx(auVar73,auVar83);
      auVar73 = vmaxps_avx(auVar78,auVar71);
      auVar70 = vmaxps_avx(auVar70,auVar73);
      auVar72 = vmaxps_avx(auVar72,auVar70);
      uVar13 = vcmpps_avx512vl(auVar72,local_460,5);
      uVar14 = vcmpps_avx512vl(auVar83,local_440,2);
      bVar31 = bVar31 & (byte)uVar13 & (byte)uVar14;
      if (bVar31 != 0) {
        auStack_600[uVar27] = (uint)bVar31;
        uVar13 = vmovlps_avx(auVar42);
        (&uStack_420)[uVar27] = uVar13;
        uVar35 = vmovlps_avx(auVar45);
        auStack_3a0[uVar27] = uVar35;
        uVar27 = (ulong)((int)uVar27 + 1);
      }
    }
    auVar42 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
    auVar110 = ZEXT1664(auVar42);
    auVar42 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
    auVar241 = ZEXT1664(auVar42);
    auVar72 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar242 = ZEXT3264(auVar72);
    auVar42 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
    auVar243 = ZEXT1664(auVar42);
    auVar42 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar244 = ZEXT1664(auVar42);
    auVar88._32_32_ = auVar104._32_32_;
    auVar88._0_32_ = _DAT_01feed20;
    auVar245 = ZEXT3264(_DAT_01feed20);
    auVar89._16_48_ = auVar88._16_48_;
    auVar90 = auVar89;
LAB_01d3e332:
    do {
      do {
        if ((int)uVar27 == 0) {
          if (bVar37) {
            return bVar37;
          }
          uVar114 = *(undefined4 *)(ray + k * 4 + 0x200);
          auVar20._4_4_ = uVar114;
          auVar20._0_4_ = uVar114;
          auVar20._8_4_ = uVar114;
          auVar20._12_4_ = uVar114;
          auVar20._16_4_ = uVar114;
          auVar20._20_4_ = uVar114;
          auVar20._24_4_ = uVar114;
          auVar20._28_4_ = uVar114;
          uVar13 = vcmpps_avx512vl(local_3c0,auVar20,2);
          uVar36 = (uint)uVar34 & (uint)uVar13;
          uVar34 = (ulong)uVar36;
          if (uVar36 == 0) {
            return bVar37;
          }
          goto LAB_01d3d6bc;
        }
        uVar32 = (int)uVar27 - 1;
        uVar33 = (ulong)uVar32;
        uVar8 = auStack_600[uVar33];
        auVar45._8_8_ = 0;
        auVar45._0_8_ = auStack_3a0[uVar33];
        uVar35 = 0;
        for (uVar29 = (ulong)uVar8; (uVar29 & 1) == 0; uVar29 = uVar29 >> 1 | 0x8000000000000000) {
          uVar35 = uVar35 + 1;
        }
        uVar28 = uVar8 - 1 & uVar8;
        bVar40 = uVar28 == 0;
        auStack_600[uVar33] = uVar28;
        if (bVar40) {
          uVar27 = (ulong)uVar32;
        }
        auVar106._8_8_ = 0;
        auVar106._0_8_ = uVar35;
        auVar42 = vpunpcklqdq_avx(auVar106,ZEXT416((int)uVar35 + 1));
        auVar104._32_32_ = auVar90._32_32_;
        auVar42 = vcvtqq2ps_avx512vl(auVar42);
        auVar42 = vmulps_avx512vl(auVar42,auVar243._0_16_);
        uVar114 = *(undefined4 *)((long)&uStack_420 + uVar33 * 8 + 4);
        auVar15._4_4_ = uVar114;
        auVar15._0_4_ = uVar114;
        auVar15._8_4_ = uVar114;
        auVar15._12_4_ = uVar114;
        auVar52 = vmulps_avx512vl(auVar42,auVar15);
        auVar43 = auVar244._0_16_;
        auVar42 = vsubps_avx512vl(auVar43,auVar42);
        uVar114 = *(undefined4 *)(&uStack_420 + uVar33);
        auVar16._4_4_ = uVar114;
        auVar16._0_4_ = uVar114;
        auVar16._8_4_ = uVar114;
        auVar16._12_4_ = uVar114;
        auVar42 = vfmadd231ps_avx512vl(auVar52,auVar42,auVar16);
        auVar52 = vmovshdup_avx(auVar42);
        fVar105 = auVar52._0_4_ - auVar42._0_4_;
        vucomiss_avx512f(ZEXT416((uint)fVar105));
        if (uVar8 == 0 || bVar40) goto LAB_01d3de27;
        auVar52 = vshufps_avx(auVar45,auVar45,0x50);
        vucomiss_avx512f(ZEXT416((uint)fVar105));
        auVar55 = vsubps_avx512vl(auVar43,auVar52);
        fVar200 = auVar52._0_4_;
        auVar140._0_4_ = fVar200 * fVar111;
        fVar211 = auVar52._4_4_;
        auVar140._4_4_ = fVar211 * fVar112;
        fVar213 = auVar52._8_4_;
        auVar140._8_4_ = fVar213 * fVar111;
        fVar210 = auVar52._12_4_;
        auVar140._12_4_ = fVar210 * fVar112;
        auVar152._0_4_ = fVar200 * fVar113;
        auVar152._4_4_ = fVar211 * fVar122;
        auVar152._8_4_ = fVar213 * fVar113;
        auVar152._12_4_ = fVar210 * fVar122;
        auVar164._0_4_ = fVar200 * fVar135;
        auVar164._4_4_ = fVar211 * fVar136;
        auVar164._8_4_ = fVar213 * fVar135;
        auVar164._12_4_ = fVar210 * fVar136;
        auVar124._0_4_ = fVar200 * fVar137;
        auVar124._4_4_ = fVar211 * fVar199;
        auVar124._8_4_ = fVar213 * fVar137;
        auVar124._12_4_ = fVar210 * fVar199;
        auVar52 = vfmadd231ps_fma(auVar140,auVar55,auVar163);
        auVar44 = vfmadd231ps_fma(auVar152,auVar55,auVar54);
        auVar46 = vfmadd231ps_fma(auVar164,auVar55,auVar53);
        auVar55 = vfmadd231ps_fma(auVar124,auVar55,auVar182);
        auVar134._16_16_ = auVar52;
        auVar134._0_16_ = auVar52;
        auVar146._16_16_ = auVar44;
        auVar146._0_16_ = auVar44;
        auVar156._16_16_ = auVar46;
        auVar156._0_16_ = auVar46;
        auVar70 = vpermps_avx512vl(auVar245._0_32_,ZEXT1632(auVar42));
        auVar72 = vsubps_avx(auVar146,auVar134);
        auVar44 = vfmadd213ps_fma(auVar72,auVar70,auVar134);
        auVar72 = vsubps_avx(auVar156,auVar146);
        auVar63 = vfmadd213ps_fma(auVar72,auVar70,auVar146);
        auVar52 = vsubps_avx(auVar55,auVar46);
        auVar147._16_16_ = auVar52;
        auVar147._0_16_ = auVar52;
        auVar52 = vfmadd213ps_fma(auVar147,auVar70,auVar156);
        auVar72 = vsubps_avx(ZEXT1632(auVar63),ZEXT1632(auVar44));
        auVar44 = vfmadd213ps_fma(auVar72,auVar70,ZEXT1632(auVar44));
        auVar72 = vsubps_avx(ZEXT1632(auVar52),ZEXT1632(auVar63));
        auVar52 = vfmadd213ps_fma(auVar72,auVar70,ZEXT1632(auVar63));
        auVar72 = vsubps_avx(ZEXT1632(auVar52),ZEXT1632(auVar44));
        auVar138 = vfmadd231ps_fma(ZEXT1632(auVar44),auVar72,auVar70);
        auVar104._0_32_ = vmulps_avx512vl(auVar72,auVar242._0_32_);
        auVar90._16_48_ = auVar104._16_48_;
        auVar52 = vmulss_avx512f(ZEXT416((uint)fVar105),SUB6416(ZEXT464(0x3eaaaaab),0));
        fVar200 = auVar52._0_4_;
        auVar165._0_8_ =
             CONCAT44(auVar138._4_4_ + fVar200 * auVar104._4_4_,
                      auVar138._0_4_ + fVar200 * auVar104._0_4_);
        auVar165._8_4_ = auVar138._8_4_ + fVar200 * auVar104._8_4_;
        auVar165._12_4_ = auVar138._12_4_ + fVar200 * auVar104._12_4_;
        auVar141._0_4_ = fVar200 * auVar104._16_4_;
        auVar141._4_4_ = fVar200 * auVar104._20_4_;
        auVar141._8_4_ = fVar200 * auVar104._24_4_;
        auVar141._12_4_ = fVar200 * auVar104._28_4_;
        auVar62 = vsubps_avx((undefined1  [16])0x0,auVar141);
        auVar63 = vshufpd_avx(auVar138,auVar138,3);
        auVar66 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
        auVar52 = vsubps_avx(auVar63,auVar138);
        auVar44 = vsubps_avx(auVar66,(undefined1  [16])0x0);
        auVar183._0_4_ = auVar52._0_4_ + auVar44._0_4_;
        auVar183._4_4_ = auVar52._4_4_ + auVar44._4_4_;
        auVar183._8_4_ = auVar52._8_4_ + auVar44._8_4_;
        auVar183._12_4_ = auVar52._12_4_ + auVar44._12_4_;
        auVar52 = vshufps_avx(auVar138,auVar138,0xb1);
        auVar44 = vshufps_avx(auVar165,auVar165,0xb1);
        auVar46 = vshufps_avx(auVar62,auVar62,0xb1);
        auVar55 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
        auVar233._4_4_ = auVar183._0_4_;
        auVar233._0_4_ = auVar183._0_4_;
        auVar233._8_4_ = auVar183._0_4_;
        auVar233._12_4_ = auVar183._0_4_;
        auVar58 = vshufps_avx(auVar183,auVar183,0x55);
        fVar200 = auVar58._0_4_;
        auVar194._0_4_ = auVar52._0_4_ * fVar200;
        fVar211 = auVar58._4_4_;
        auVar194._4_4_ = auVar52._4_4_ * fVar211;
        fVar213 = auVar58._8_4_;
        auVar194._8_4_ = auVar52._8_4_ * fVar213;
        fVar210 = auVar58._12_4_;
        auVar194._12_4_ = auVar52._12_4_ * fVar210;
        auVar202._0_4_ = auVar44._0_4_ * fVar200;
        auVar202._4_4_ = auVar44._4_4_ * fVar211;
        auVar202._8_4_ = auVar44._8_4_ * fVar213;
        auVar202._12_4_ = auVar44._12_4_ * fVar210;
        auVar217._0_4_ = auVar46._0_4_ * fVar200;
        auVar217._4_4_ = auVar46._4_4_ * fVar211;
        auVar217._8_4_ = auVar46._8_4_ * fVar213;
        auVar217._12_4_ = auVar46._12_4_ * fVar210;
        auVar184._0_4_ = auVar55._0_4_ * fVar200;
        auVar184._4_4_ = auVar55._4_4_ * fVar211;
        auVar184._8_4_ = auVar55._8_4_ * fVar213;
        auVar184._12_4_ = auVar55._12_4_ * fVar210;
        auVar52 = vfmadd231ps_fma(auVar194,auVar233,auVar138);
        auVar44 = vfmadd231ps_fma(auVar202,auVar233,auVar165);
        auVar60 = vfmadd231ps_fma(auVar217,auVar233,auVar62);
        auVar61 = vfmadd231ps_fma(auVar184,(undefined1  [16])0x0,auVar233);
        auVar58 = vshufpd_avx(auVar52,auVar52,1);
        auVar59 = vshufpd_avx(auVar44,auVar44,1);
        auVar56 = vshufpd_avx512vl(auVar60,auVar60,1);
        auVar57 = vshufpd_avx512vl(auVar61,auVar61,1);
        auVar46 = vminss_avx(auVar52,auVar44);
        auVar52 = vmaxss_avx(auVar44,auVar52);
        auVar55 = vminss_avx(auVar60,auVar61);
        auVar44 = vmaxss_avx(auVar61,auVar60);
        auVar46 = vminss_avx(auVar46,auVar55);
        auVar52 = vmaxss_avx(auVar44,auVar52);
        auVar55 = vminss_avx(auVar58,auVar59);
        auVar44 = vmaxss_avx(auVar59,auVar58);
        auVar58 = vminss_avx512f(auVar56,auVar57);
        auVar59 = vmaxss_avx512f(auVar57,auVar56);
        auVar44 = vmaxss_avx(auVar59,auVar44);
        auVar90._0_16_ = vminss_avx512f(auVar55,auVar58);
        fVar211 = auVar44._0_4_;
        fVar200 = auVar52._0_4_;
        if (auVar46._0_4_ < 0.0001) {
          bVar41 = fVar211 == -0.0001;
          bVar38 = NAN(fVar211);
          if (fVar211 <= -0.0001) goto LAB_01d3e565;
          break;
        }
LAB_01d3e565:
        vucomiss_avx512f(auVar90._0_16_);
        bVar41 = fVar211 <= -0.0001;
        bVar39 = -0.0001 < fVar200;
        bVar38 = bVar41;
        if (!bVar41) break;
        uVar13 = vcmpps_avx512vl(auVar46,SUB6416(ZEXT464(0x38d1b717),0),5);
        uVar14 = vcmpps_avx512vl(auVar90._0_16_,SUB6416(ZEXT464(0x38d1b717),0),5);
        bVar31 = (byte)uVar13 & (byte)uVar14 & 1;
        bVar41 = bVar39 && bVar31 == 0;
        bVar38 = bVar39 && bVar31 == 0;
      } while (!bVar39 || bVar31 != 0);
      auVar59 = auVar246._0_16_;
      vcmpss_avx512f(auVar46,auVar59,1);
      uVar13 = vcmpss_avx512f(auVar52,auVar59,1);
      bVar39 = (bool)((byte)uVar13 & 1);
      auVar92._16_48_ = auVar90._16_48_;
      auVar92._0_16_ = auVar247._0_16_;
      auVar91._4_60_ = auVar92._4_60_;
      auVar91._0_4_ = (float)((uint)bVar39 * -0x40800000 + (uint)!bVar39 * auVar247._0_4_);
      vucomiss_avx512f(auVar91._0_16_);
      bVar38 = (bool)(!bVar41 | bVar38);
      bVar39 = bVar38 == false;
      auVar94._16_48_ = auVar90._16_48_;
      auVar94._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
      auVar93._4_60_ = auVar94._4_60_;
      auVar93._0_4_ = (uint)bVar38 * auVar246._0_4_ + (uint)!bVar38 * 0x7f800000;
      auVar58 = auVar93._0_16_;
      auVar96._16_48_ = auVar90._16_48_;
      auVar96._0_16_ = SUB6416(ZEXT464(0xff800000),0);
      auVar95._4_60_ = auVar96._4_60_;
      auVar95._0_4_ = (uint)bVar38 * auVar246._0_4_ + (uint)!bVar38 * -0x800000;
      auVar55 = auVar95._0_16_;
      uVar13 = vcmpss_avx512f(auVar90._0_16_,auVar59,1);
      bVar41 = (bool)((byte)uVar13 & 1);
      auVar98._16_48_ = auVar90._16_48_;
      auVar98._0_16_ = auVar247._0_16_;
      auVar97._4_60_ = auVar98._4_60_;
      auVar97._0_4_ = (float)((uint)bVar41 * -0x40800000 + (uint)!bVar41 * auVar247._0_4_);
      vucomiss_avx512f(auVar97._0_16_);
      if ((bVar38) || (bVar39)) {
        auVar60 = vucomiss_avx512f(auVar46);
        if ((bVar38) || (bVar39)) {
          auVar19._8_4_ = 0x80000000;
          auVar19._0_8_ = 0x8000000080000000;
          auVar19._12_4_ = 0x80000000;
          auVar61 = vxorps_avx512vl(auVar46,auVar19);
          auVar46 = vsubss_avx512f(auVar60,auVar46);
          auVar46 = vdivss_avx512f(auVar61,auVar46);
          auVar60 = vsubss_avx512f(ZEXT416(0x3f800000),auVar46);
          auVar60 = vfmadd213ss_avx512f(auVar60,auVar59,auVar46);
          auVar46 = auVar60;
        }
        else {
          auVar46 = vxorps_avx512vl(auVar60,auVar60);
          vucomiss_avx512f(auVar46);
          auVar60 = ZEXT416(0x3f800000);
          if ((bVar38) || (bVar39)) {
            auVar60 = SUB6416(ZEXT464(0xff800000),0);
            auVar46 = SUB6416(ZEXT464(0x7f800000),0);
          }
        }
        auVar58 = vminss_avx512f(auVar58,auVar46);
        auVar55 = vmaxss_avx(auVar60,auVar55);
      }
      auVar247 = ZEXT464(0x3f800000);
      uVar13 = vcmpss_avx512f(auVar44,auVar59,1);
      bVar41 = (bool)((byte)uVar13 & 1);
      auVar44 = auVar247._0_16_;
      fVar213 = (float)((uint)bVar41 * -0x40800000 + (uint)!bVar41 * 0x3f800000);
      if ((auVar91._0_4_ != fVar213) || (NAN(auVar91._0_4_) || NAN(fVar213))) {
        if ((fVar211 != fVar200) || (NAN(fVar211) || NAN(fVar200))) {
          auVar18._8_4_ = 0x80000000;
          auVar18._0_8_ = 0x8000000080000000;
          auVar18._12_4_ = 0x80000000;
          auVar52 = vxorps_avx512vl(auVar52,auVar18);
          auVar185._0_4_ = auVar52._0_4_ / (fVar211 - fVar200);
          auVar185._4_12_ = auVar52._4_12_;
          auVar52 = vsubss_avx512f(auVar44,auVar185);
          auVar52 = vfmadd213ss_avx512f(auVar52,auVar59,auVar185);
          auVar46 = auVar52;
        }
        else if ((fVar200 != 0.0) ||
                (auVar52 = auVar44, auVar46 = SUB6416(ZEXT864(0),0) << 0x20, NAN(fVar200))) {
          auVar52 = SUB6416(ZEXT464(0xff800000),0);
          auVar46 = SUB6416(ZEXT464(0x7f800000),0);
        }
        auVar58 = vminss_avx(auVar58,auVar46);
        auVar55 = vmaxss_avx(auVar52,auVar55);
      }
      bVar41 = auVar97._0_4_ != fVar213;
      auVar52 = vminss_avx512f(auVar58,auVar44);
      auVar100._16_48_ = auVar90._16_48_;
      auVar100._0_16_ = auVar58;
      auVar99._4_60_ = auVar100._4_60_;
      auVar99._0_4_ = (uint)bVar41 * auVar52._0_4_ + (uint)!bVar41 * auVar58._0_4_;
      auVar52 = vmaxss_avx512f(auVar44,auVar55);
      auVar102._16_48_ = auVar90._16_48_;
      auVar102._0_16_ = auVar55;
      auVar101._4_60_ = auVar102._4_60_;
      auVar101._0_4_ = (uint)bVar41 * auVar52._0_4_ + (uint)!bVar41 * auVar55._0_4_;
      auVar52 = vmaxss_avx512f(auVar59,auVar99._0_16_);
      auVar90._0_16_ = vminss_avx512f(auVar101._0_16_,auVar44);
    } while (auVar90._0_4_ < auVar52._0_4_);
    auVar60 = vmaxss_avx512f(auVar59,ZEXT416((uint)(auVar52._0_4_ + -0.1)));
    auVar61 = vminss_avx512f(ZEXT416((uint)(auVar90._0_4_ + 0.1)),auVar44);
    auVar125._0_8_ = auVar138._0_8_;
    auVar125._8_8_ = auVar125._0_8_;
    auVar203._8_8_ = auVar165._0_8_;
    auVar203._0_8_ = auVar165._0_8_;
    auVar218._8_8_ = auVar62._0_8_;
    auVar218._0_8_ = auVar62._0_8_;
    auVar52 = vshufpd_avx(auVar165,auVar165,3);
    auVar46 = vshufpd_avx(auVar62,auVar62,3);
    auVar55 = vshufps_avx(auVar60,auVar61,0);
    auVar59 = vsubps_avx512vl(auVar43,auVar55);
    fVar200 = auVar55._0_4_;
    auVar153._0_4_ = fVar200 * auVar63._0_4_;
    fVar211 = auVar55._4_4_;
    auVar153._4_4_ = fVar211 * auVar63._4_4_;
    fVar213 = auVar55._8_4_;
    auVar153._8_4_ = fVar213 * auVar63._8_4_;
    fVar210 = auVar55._12_4_;
    auVar153._12_4_ = fVar210 * auVar63._12_4_;
    auVar166._0_4_ = fVar200 * auVar52._0_4_;
    auVar166._4_4_ = fVar211 * auVar52._4_4_;
    auVar166._8_4_ = fVar213 * auVar52._8_4_;
    auVar166._12_4_ = fVar210 * auVar52._12_4_;
    auVar236._0_4_ = auVar46._0_4_ * fVar200;
    auVar236._4_4_ = auVar46._4_4_ * fVar211;
    auVar236._8_4_ = auVar46._8_4_ * fVar213;
    auVar236._12_4_ = auVar46._12_4_ * fVar210;
    auVar142._0_4_ = fVar200 * auVar66._0_4_;
    auVar142._4_4_ = fVar211 * auVar66._4_4_;
    auVar142._8_4_ = fVar213 * auVar66._8_4_;
    auVar142._12_4_ = fVar210 * auVar66._12_4_;
    auVar63 = vfmadd231ps_fma(auVar153,auVar59,auVar125);
    auVar66 = vfmadd231ps_fma(auVar166,auVar59,auVar203);
    auVar58 = vfmadd231ps_fma(auVar236,auVar59,auVar218);
    auVar59 = vfmadd231ps_fma(auVar142,auVar59,ZEXT816(0));
    auVar46 = vsubss_avx512f(auVar44,auVar60);
    auVar52 = vmovshdup_avx(auVar45);
    auVar138 = vfmadd231ss_fma(ZEXT416((uint)(auVar52._0_4_ * auVar60._0_4_)),auVar45,auVar46);
    auVar46 = vsubss_avx512f(auVar44,auVar61);
    auVar56 = vfmadd231ss_fma(ZEXT416((uint)(auVar52._0_4_ * auVar61._0_4_)),auVar45,auVar46);
    auVar62 = vdivss_avx512f(auVar44,ZEXT416((uint)fVar105));
    auVar52 = vsubps_avx(auVar66,auVar63);
    auVar60 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar46 = vmulps_avx512vl(auVar52,auVar60);
    auVar52 = vsubps_avx(auVar58,auVar66);
    auVar55 = vmulps_avx512vl(auVar52,auVar60);
    auVar52 = vsubps_avx(auVar59,auVar58);
    auVar52 = vmulps_avx512vl(auVar52,auVar60);
    auVar45 = vminps_avx(auVar55,auVar52);
    auVar52 = vmaxps_avx(auVar55,auVar52);
    auVar45 = vminps_avx(auVar46,auVar45);
    auVar52 = vmaxps_avx(auVar46,auVar52);
    auVar46 = vshufpd_avx(auVar45,auVar45,3);
    auVar55 = vshufpd_avx(auVar52,auVar52,3);
    auVar45 = vminps_avx(auVar45,auVar46);
    auVar52 = vmaxps_avx(auVar52,auVar55);
    fVar105 = auVar62._0_4_;
    auVar186._0_4_ = auVar45._0_4_ * fVar105;
    auVar186._4_4_ = auVar45._4_4_ * fVar105;
    auVar186._8_4_ = auVar45._8_4_ * fVar105;
    auVar186._12_4_ = auVar45._12_4_ * fVar105;
    auVar173._0_4_ = fVar105 * auVar52._0_4_;
    auVar173._4_4_ = fVar105 * auVar52._4_4_;
    auVar173._8_4_ = fVar105 * auVar52._8_4_;
    auVar173._12_4_ = fVar105 * auVar52._12_4_;
    auVar62 = vdivss_avx512f(auVar44,ZEXT416((uint)(auVar56._0_4_ - auVar138._0_4_)));
    auVar52 = vshufpd_avx(auVar63,auVar63,3);
    auVar45 = vshufpd_avx(auVar66,auVar66,3);
    auVar46 = vshufpd_avx(auVar58,auVar58,3);
    auVar55 = vshufpd_avx(auVar59,auVar59,3);
    auVar52 = vsubps_avx(auVar52,auVar63);
    auVar63 = vsubps_avx(auVar45,auVar66);
    auVar66 = vsubps_avx(auVar46,auVar58);
    auVar55 = vsubps_avx(auVar55,auVar59);
    auVar45 = vminps_avx(auVar52,auVar63);
    auVar52 = vmaxps_avx(auVar52,auVar63);
    auVar46 = vminps_avx(auVar66,auVar55);
    auVar46 = vminps_avx(auVar45,auVar46);
    auVar45 = vmaxps_avx(auVar66,auVar55);
    auVar52 = vmaxps_avx(auVar52,auVar45);
    fVar105 = auVar62._0_4_;
    auVar219._0_4_ = fVar105 * auVar46._0_4_;
    auVar219._4_4_ = fVar105 * auVar46._4_4_;
    auVar219._8_4_ = fVar105 * auVar46._8_4_;
    auVar219._12_4_ = fVar105 * auVar46._12_4_;
    auVar204._0_4_ = fVar105 * auVar52._0_4_;
    auVar204._4_4_ = fVar105 * auVar52._4_4_;
    auVar204._8_4_ = fVar105 * auVar52._8_4_;
    auVar204._12_4_ = fVar105 * auVar52._12_4_;
    auVar55 = vinsertps_avx(auVar42,auVar138,0x10);
    auVar57 = vpermt2ps_avx512vl(auVar42,_DAT_01feecd0,auVar56);
    auVar115._0_4_ = auVar55._0_4_ + auVar57._0_4_;
    auVar115._4_4_ = auVar55._4_4_ + auVar57._4_4_;
    auVar115._8_4_ = auVar55._8_4_ + auVar57._8_4_;
    auVar115._12_4_ = auVar55._12_4_ + auVar57._12_4_;
    auVar62 = vmulps_avx512vl(auVar115,auVar110._0_16_);
    auVar45 = vshufps_avx(auVar62,auVar62,0x54);
    uVar114 = auVar62._0_4_;
    auVar117._4_4_ = uVar114;
    auVar117._0_4_ = uVar114;
    auVar117._8_4_ = uVar114;
    auVar117._12_4_ = uVar114;
    auVar46 = vfmadd213ps_fma(auVar89._0_16_,auVar117,auVar4);
    auVar63 = vfmadd213ps_fma(local_470,auVar117,auVar51);
    auVar66 = vfmadd213ps_fma(local_480,auVar117,auVar5);
    auVar52 = vsubps_avx(auVar63,auVar46);
    auVar46 = vfmadd213ps_fma(auVar52,auVar117,auVar46);
    auVar52 = vsubps_avx(auVar66,auVar63);
    auVar52 = vfmadd213ps_fma(auVar52,auVar117,auVar63);
    auVar52 = vsubps_avx(auVar52,auVar46);
    auVar46 = vfmadd231ps_fma(auVar46,auVar52,auVar117);
    auVar58 = vmulps_avx512vl(auVar52,auVar60);
    auVar227._8_8_ = auVar46._0_8_;
    auVar227._0_8_ = auVar46._0_8_;
    auVar52 = vshufpd_avx(auVar46,auVar46,3);
    auVar46 = vshufps_avx(auVar62,auVar62,0x55);
    auVar63 = vsubps_avx(auVar52,auVar227);
    auVar66 = vfmadd231ps_fma(auVar227,auVar46,auVar63);
    auVar237._8_8_ = auVar58._0_8_;
    auVar237._0_8_ = auVar58._0_8_;
    auVar52 = vshufpd_avx(auVar58,auVar58,3);
    auVar52 = vsubps_avx512vl(auVar52,auVar237);
    auVar52 = vfmadd213ps_avx512vl(auVar52,auVar46,auVar237);
    auVar46 = vxorps_avx512vl(auVar63,auVar248._0_16_);
    auVar58 = vmovshdup_avx512vl(auVar52);
    auVar59 = vxorps_avx512vl(auVar58,auVar248._0_16_);
    auVar60 = vmovshdup_avx512vl(auVar63);
    auVar59 = vpermt2ps_avx512vl(auVar59,ZEXT416(5),auVar63);
    auVar63 = vfmsub231ss_avx512f(ZEXT416((uint)(auVar58._0_4_ * auVar63._0_4_)),auVar52,auVar60);
    auVar46 = vpermt2ps_avx512vl(auVar52,SUB6416(ZEXT464(4),0),auVar46);
    auVar143._0_4_ = auVar63._0_4_;
    auVar143._4_4_ = auVar143._0_4_;
    auVar143._8_4_ = auVar143._0_4_;
    auVar143._12_4_ = auVar143._0_4_;
    auVar52 = vdivps_avx(auVar59,auVar143);
    auVar64 = vdivps_avx512vl(auVar46,auVar143);
    fVar105 = auVar66._0_4_;
    auVar46 = vshufps_avx(auVar66,auVar66,0x55);
    auVar228._0_4_ = fVar105 * auVar52._0_4_ + auVar46._0_4_ * auVar64._0_4_;
    auVar228._4_4_ = fVar105 * auVar52._4_4_ + auVar46._4_4_ * auVar64._4_4_;
    auVar228._8_4_ = fVar105 * auVar52._8_4_ + auVar46._8_4_ * auVar64._8_4_;
    auVar228._12_4_ = fVar105 * auVar52._12_4_ + auVar46._12_4_ * auVar64._12_4_;
    auVar60 = vsubps_avx(auVar45,auVar228);
    auVar46 = vmovshdup_avx(auVar52);
    auVar45 = vinsertps_avx(auVar186,auVar219,0x1c);
    auVar238._0_4_ = auVar46._0_4_ * auVar45._0_4_;
    auVar238._4_4_ = auVar46._4_4_ * auVar45._4_4_;
    auVar238._8_4_ = auVar46._8_4_ * auVar45._8_4_;
    auVar238._12_4_ = auVar46._12_4_ * auVar45._12_4_;
    auVar61 = vinsertps_avx512f(auVar173,auVar204,0x1c);
    auVar46 = vmulps_avx512vl(auVar46,auVar61);
    auVar59 = vminps_avx512vl(auVar238,auVar46);
    auVar66 = vmaxps_avx(auVar46,auVar238);
    auVar58 = vmovshdup_avx(auVar64);
    auVar46 = vinsertps_avx(auVar219,auVar186,0x4c);
    auVar220._0_4_ = auVar58._0_4_ * auVar46._0_4_;
    auVar220._4_4_ = auVar58._4_4_ * auVar46._4_4_;
    auVar220._8_4_ = auVar58._8_4_ * auVar46._8_4_;
    auVar220._12_4_ = auVar58._12_4_ * auVar46._12_4_;
    auVar63 = vinsertps_avx(auVar204,auVar173,0x4c);
    auVar205._0_4_ = auVar58._0_4_ * auVar63._0_4_;
    auVar205._4_4_ = auVar58._4_4_ * auVar63._4_4_;
    auVar205._8_4_ = auVar58._8_4_ * auVar63._8_4_;
    auVar205._12_4_ = auVar58._12_4_ * auVar63._12_4_;
    auVar58 = vminps_avx(auVar220,auVar205);
    auVar59 = vaddps_avx512vl(auVar59,auVar58);
    auVar58 = vmaxps_avx(auVar205,auVar220);
    auVar206._0_4_ = auVar66._0_4_ + auVar58._0_4_;
    auVar206._4_4_ = auVar66._4_4_ + auVar58._4_4_;
    auVar206._8_4_ = auVar66._8_4_ + auVar58._8_4_;
    auVar206._12_4_ = auVar66._12_4_ + auVar58._12_4_;
    auVar221._8_8_ = 0x3f80000000000000;
    auVar221._0_8_ = 0x3f80000000000000;
    auVar66 = vsubps_avx(auVar221,auVar206);
    auVar58 = vsubps_avx(auVar221,auVar59);
    auVar59 = vsubps_avx(auVar55,auVar62);
    auVar62 = vsubps_avx(auVar57,auVar62);
    fVar210 = auVar59._0_4_;
    auVar239._0_4_ = fVar210 * auVar66._0_4_;
    fVar212 = auVar59._4_4_;
    auVar239._4_4_ = fVar212 * auVar66._4_4_;
    fVar214 = auVar59._8_4_;
    auVar239._8_4_ = fVar214 * auVar66._8_4_;
    fVar215 = auVar59._12_4_;
    auVar239._12_4_ = fVar215 * auVar66._12_4_;
    auVar65 = vbroadcastss_avx512vl(auVar52);
    auVar45 = vmulps_avx512vl(auVar65,auVar45);
    auVar61 = vmulps_avx512vl(auVar65,auVar61);
    auVar65 = vminps_avx512vl(auVar45,auVar61);
    auVar61 = vmaxps_avx512vl(auVar61,auVar45);
    auVar45 = vbroadcastss_avx512vl(auVar64);
    auVar46 = vmulps_avx512vl(auVar45,auVar46);
    auVar45 = vmulps_avx512vl(auVar45,auVar63);
    auVar63 = vminps_avx512vl(auVar46,auVar45);
    auVar63 = vaddps_avx512vl(auVar65,auVar63);
    auVar59 = vmulps_avx512vl(auVar59,auVar58);
    fVar105 = auVar62._0_4_;
    auVar207._0_4_ = fVar105 * auVar66._0_4_;
    fVar200 = auVar62._4_4_;
    auVar207._4_4_ = fVar200 * auVar66._4_4_;
    fVar211 = auVar62._8_4_;
    auVar207._8_4_ = fVar211 * auVar66._8_4_;
    fVar213 = auVar62._12_4_;
    auVar207._12_4_ = fVar213 * auVar66._12_4_;
    auVar222._0_4_ = fVar105 * auVar58._0_4_;
    auVar222._4_4_ = fVar200 * auVar58._4_4_;
    auVar222._8_4_ = fVar211 * auVar58._8_4_;
    auVar222._12_4_ = fVar213 * auVar58._12_4_;
    auVar45 = vmaxps_avx(auVar45,auVar46);
    auVar174._0_4_ = auVar61._0_4_ + auVar45._0_4_;
    auVar174._4_4_ = auVar61._4_4_ + auVar45._4_4_;
    auVar174._8_4_ = auVar61._8_4_ + auVar45._8_4_;
    auVar174._12_4_ = auVar61._12_4_ + auVar45._12_4_;
    auVar187._8_8_ = 0x3f800000;
    auVar187._0_8_ = 0x3f800000;
    auVar45 = vsubps_avx(auVar187,auVar174);
    auVar46 = vsubps_avx512vl(auVar187,auVar63);
    auVar234._0_4_ = fVar210 * auVar45._0_4_;
    auVar234._4_4_ = fVar212 * auVar45._4_4_;
    auVar234._8_4_ = fVar214 * auVar45._8_4_;
    auVar234._12_4_ = fVar215 * auVar45._12_4_;
    auVar229._0_4_ = fVar210 * auVar46._0_4_;
    auVar229._4_4_ = fVar212 * auVar46._4_4_;
    auVar229._8_4_ = fVar214 * auVar46._8_4_;
    auVar229._12_4_ = fVar215 * auVar46._12_4_;
    auVar175._0_4_ = fVar105 * auVar45._0_4_;
    auVar175._4_4_ = fVar200 * auVar45._4_4_;
    auVar175._8_4_ = fVar211 * auVar45._8_4_;
    auVar175._12_4_ = fVar213 * auVar45._12_4_;
    auVar188._0_4_ = fVar105 * auVar46._0_4_;
    auVar188._4_4_ = fVar200 * auVar46._4_4_;
    auVar188._8_4_ = fVar211 * auVar46._8_4_;
    auVar188._12_4_ = fVar213 * auVar46._12_4_;
    auVar45 = vminps_avx(auVar234,auVar229);
    auVar46 = vminps_avx512vl(auVar175,auVar188);
    auVar63 = vminps_avx512vl(auVar45,auVar46);
    auVar45 = vmaxps_avx(auVar229,auVar234);
    auVar46 = vmaxps_avx(auVar188,auVar175);
    auVar46 = vmaxps_avx(auVar46,auVar45);
    auVar66 = vminps_avx512vl(auVar239,auVar59);
    auVar45 = vminps_avx(auVar207,auVar222);
    auVar45 = vminps_avx(auVar66,auVar45);
    auVar45 = vhaddps_avx(auVar63,auVar45);
    auVar66 = vmaxps_avx512vl(auVar59,auVar239);
    auVar63 = vmaxps_avx(auVar222,auVar207);
    auVar63 = vmaxps_avx(auVar63,auVar66);
    auVar46 = vhaddps_avx(auVar46,auVar63);
    auVar45 = vshufps_avx(auVar45,auVar45,0xe8);
    auVar46 = vshufps_avx(auVar46,auVar46,0xe8);
    auVar176._0_4_ = auVar45._0_4_ + auVar60._0_4_;
    auVar176._4_4_ = auVar45._4_4_ + auVar60._4_4_;
    auVar176._8_4_ = auVar45._8_4_ + auVar60._8_4_;
    auVar176._12_4_ = auVar45._12_4_ + auVar60._12_4_;
    auVar189._0_4_ = auVar46._0_4_ + auVar60._0_4_;
    auVar189._4_4_ = auVar46._4_4_ + auVar60._4_4_;
    auVar189._8_4_ = auVar46._8_4_ + auVar60._8_4_;
    auVar189._12_4_ = auVar46._12_4_ + auVar60._12_4_;
    auVar45 = vmaxps_avx(auVar55,auVar176);
    auVar46 = vminps_avx(auVar189,auVar57);
    uVar35 = vcmpps_avx512vl(auVar46,auVar45,1);
    auVar45 = ZEXT416(5);
    if ((uVar35 & 3) != 0) {
      auVar90._0_16_ = vxorps_avx512vl(ZEXT416(5),auVar45);
      auVar246 = ZEXT1664(auVar90._0_16_);
      goto LAB_01d3e332;
    }
    uVar35 = vcmpps_avx512vl(auVar189,auVar57,1);
    uVar13 = vcmpps_avx512vl(auVar42,auVar176,1);
    if (((ushort)uVar13 & (ushort)uVar35 & 1) == 0) {
      bVar31 = 0;
    }
    else {
      auVar46 = vmovshdup_avx(auVar176);
      bVar31 = auVar138._0_4_ < auVar46._0_4_ & (byte)(uVar35 >> 1) & 0x7f;
    }
    auVar103._0_16_ = vxorps_avx512vl(auVar45,auVar45);
    auVar103._16_48_ = auVar90._16_48_;
    auVar246 = ZEXT1664(auVar103._0_16_);
    local_610 = auVar50._0_4_;
    fStack_60c = auVar50._4_4_;
    fStack_608 = auVar50._8_4_;
    fStack_604 = auVar50._12_4_;
    if (((3 < (uint)uVar27 || uVar8 != 0 && !bVar40) | bVar31) == 1) {
      lVar30 = 200;
      auVar90 = auVar103;
      do {
        auVar42 = vsubss_avx512f(auVar44,auVar60);
        fVar211 = auVar42._0_4_;
        fVar105 = fVar211 * fVar211 * fVar211;
        fVar213 = auVar60._0_4_;
        fVar200 = fVar213 * 3.0 * fVar211 * fVar211;
        fVar211 = fVar211 * fVar213 * fVar213 * 3.0;
        auVar131._4_4_ = fVar105;
        auVar131._0_4_ = fVar105;
        auVar131._8_4_ = fVar105;
        auVar131._12_4_ = fVar105;
        auVar126._4_4_ = fVar200;
        auVar126._0_4_ = fVar200;
        auVar126._8_4_ = fVar200;
        auVar126._12_4_ = fVar200;
        auVar107._4_4_ = fVar211;
        auVar107._0_4_ = fVar211;
        auVar107._8_4_ = fVar211;
        auVar107._12_4_ = fVar211;
        fVar213 = fVar213 * fVar213 * fVar213;
        auVar154._0_4_ = local_610 * fVar213;
        auVar154._4_4_ = fStack_60c * fVar213;
        auVar154._8_4_ = fStack_608 * fVar213;
        auVar154._12_4_ = fStack_604 * fVar213;
        auVar42 = vfmadd231ps_fma(auVar154,auVar5,auVar107);
        auVar42 = vfmadd231ps_fma(auVar42,auVar51,auVar126);
        auVar42 = vfmadd231ps_fma(auVar42,auVar4,auVar131);
        auVar108._8_8_ = auVar42._0_8_;
        auVar108._0_8_ = auVar42._0_8_;
        auVar42 = vshufpd_avx(auVar42,auVar42,3);
        auVar45 = vshufps_avx(auVar60,auVar60,0x55);
        auVar42 = vsubps_avx(auVar42,auVar108);
        auVar45 = vfmadd213ps_fma(auVar42,auVar45,auVar108);
        fVar105 = auVar45._0_4_;
        auVar42 = vshufps_avx(auVar45,auVar45,0x55);
        auVar109._0_4_ = auVar52._0_4_ * fVar105 + auVar64._0_4_ * auVar42._0_4_;
        auVar109._4_4_ = auVar52._4_4_ * fVar105 + auVar64._4_4_ * auVar42._4_4_;
        auVar109._8_4_ = auVar52._8_4_ * fVar105 + auVar64._8_4_ * auVar42._8_4_;
        auVar109._12_4_ = auVar52._12_4_ * fVar105 + auVar64._12_4_ * auVar42._12_4_;
        auVar60 = vsubps_avx(auVar60,auVar109);
        auVar42 = vandps_avx512vl(auVar45,auVar241._0_16_);
        auVar90._0_16_ = vprolq_avx512vl(auVar42,0x20);
        auVar42 = vmaxss_avx(auVar90._0_16_,auVar42);
        bVar40 = auVar42._0_4_ <= fVar123;
        if (auVar42._0_4_ < fVar123) {
          auVar42 = vucomiss_avx512f(auVar103._0_16_);
          if (bVar40) {
            auVar52 = vucomiss_avx512f(auVar42);
            auVar247 = ZEXT1664(auVar52);
            if (bVar40) {
              vmovshdup_avx(auVar42);
              auVar52 = vucomiss_avx512f(auVar103._0_16_);
              if (bVar40) {
                auVar45 = vucomiss_avx512f(auVar52);
                auVar247 = ZEXT1664(auVar45);
                if (bVar40) {
                  auVar44 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                          ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),0x1c);
                  auVar62 = vinsertps_avx(auVar44,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128[2]
                                                         ),0x28);
                  auVar44 = vdpps_avx(auVar62,local_490,0x7f);
                  auVar46 = vdpps_avx(auVar62,local_4a0,0x7f);
                  auVar55 = vdpps_avx(auVar62,local_4b0,0x7f);
                  auVar63 = vdpps_avx(auVar62,local_4c0,0x7f);
                  auVar66 = vdpps_avx(auVar62,local_4d0,0x7f);
                  auVar58 = vdpps_avx(auVar62,local_4e0,0x7f);
                  auVar59 = vdpps_avx(auVar62,local_4f0,0x7f);
                  auVar62 = vdpps_avx(auVar62,local_500,0x7f);
                  auVar60 = vsubss_avx512f(auVar45,auVar52);
                  fVar105 = auVar52._0_4_;
                  auVar52 = vfmadd231ss_fma(ZEXT416((uint)(fVar105 * auVar66._0_4_)),auVar60,auVar44
                                           );
                  auVar44 = vfmadd231ss_fma(ZEXT416((uint)(auVar58._0_4_ * fVar105)),auVar60,auVar46
                                           );
                  auVar46 = vfmadd231ss_fma(ZEXT416((uint)(auVar59._0_4_ * fVar105)),auVar60,auVar55
                                           );
                  auVar55 = vfmadd231ss_fma(ZEXT416((uint)(fVar105 * auVar62._0_4_)),auVar60,auVar63
                                           );
                  auVar90._0_16_ = vsubss_avx512f(auVar45,auVar42);
                  auVar155._0_4_ = auVar90._0_4_;
                  fVar105 = auVar155._0_4_ * auVar155._0_4_ * auVar155._0_4_;
                  fVar213 = auVar42._0_4_;
                  fVar200 = fVar213 * 3.0 * auVar155._0_4_ * auVar155._0_4_;
                  fVar211 = auVar155._0_4_ * fVar213 * fVar213 * 3.0;
                  fVar210 = fVar213 * fVar213 * fVar213;
                  auVar45 = vfmadd231ss_fma(ZEXT416((uint)(fVar210 * auVar55._0_4_)),
                                            ZEXT416((uint)fVar211),auVar46);
                  auVar45 = vfmadd231ss_fma(auVar45,ZEXT416((uint)fVar200),auVar44);
                  vfmadd231ss_fma(auVar45,ZEXT416((uint)fVar105),auVar52);
                  auVar52 = vucomiss_avx512f(ZEXT416(uVar1));
                  if (bVar40) {
                    fVar212 = *(float *)(ray + k * 4 + 0x200);
                    if (auVar52._0_4_ <= fVar212) {
                      auVar45 = vshufps_avx(auVar42,auVar42,0x55);
                      auVar46 = vsubps_avx512vl(auVar43,auVar45);
                      fVar214 = auVar45._0_4_;
                      auVar190._0_4_ = fVar214 * (float)local_520._0_4_;
                      fVar215 = auVar45._4_4_;
                      auVar190._4_4_ = fVar215 * (float)local_520._4_4_;
                      fVar223 = auVar45._8_4_;
                      auVar190._8_4_ = fVar223 * fStack_518;
                      fVar224 = auVar45._12_4_;
                      auVar190._12_4_ = fVar224 * fStack_514;
                      auVar195._0_4_ = fVar214 * (float)local_570._0_4_;
                      auVar195._4_4_ = fVar215 * (float)local_570._4_4_;
                      auVar195._8_4_ = fVar223 * fStack_568;
                      auVar195._12_4_ = fVar224 * fStack_564;
                      auVar208._0_4_ = fVar214 * (float)local_580._0_4_;
                      auVar208._4_4_ = fVar215 * (float)local_580._4_4_;
                      auVar208._8_4_ = fVar223 * fStack_578;
                      auVar208._12_4_ = fVar224 * fStack_574;
                      auVar167._0_4_ = fVar214 * (float)local_540._0_4_;
                      auVar167._4_4_ = fVar215 * (float)local_540._4_4_;
                      auVar167._8_4_ = fVar223 * fStack_538;
                      auVar167._12_4_ = fVar224 * fStack_534;
                      auVar45 = vfmadd231ps_fma(auVar190,auVar46,local_510);
                      auVar43 = vfmadd231ps_fma(auVar195,auVar46,local_550);
                      auVar44 = vfmadd231ps_fma(auVar208,auVar46,local_560);
                      auVar46 = vfmadd231ps_fma(auVar167,auVar46,local_530);
                      auVar45 = vsubps_avx(auVar43,auVar45);
                      auVar43 = vsubps_avx(auVar44,auVar43);
                      auVar44 = vsubps_avx(auVar46,auVar44);
                      auVar209._0_4_ = fVar213 * auVar43._0_4_;
                      auVar209._4_4_ = fVar213 * auVar43._4_4_;
                      auVar209._8_4_ = fVar213 * auVar43._8_4_;
                      auVar209._12_4_ = fVar213 * auVar43._12_4_;
                      auVar155._4_4_ = auVar155._0_4_;
                      auVar155._8_4_ = auVar155._0_4_;
                      auVar155._12_4_ = auVar155._0_4_;
                      auVar45 = vfmadd231ps_fma(auVar209,auVar155,auVar45);
                      auVar168._0_4_ = fVar213 * auVar44._0_4_;
                      auVar168._4_4_ = fVar213 * auVar44._4_4_;
                      auVar168._8_4_ = fVar213 * auVar44._8_4_;
                      auVar168._12_4_ = fVar213 * auVar44._12_4_;
                      auVar43 = vfmadd231ps_fma(auVar168,auVar155,auVar43);
                      auVar169._0_4_ = fVar213 * auVar43._0_4_;
                      auVar169._4_4_ = fVar213 * auVar43._4_4_;
                      auVar169._8_4_ = fVar213 * auVar43._8_4_;
                      auVar169._12_4_ = fVar213 * auVar43._12_4_;
                      auVar45 = vfmadd231ps_fma(auVar169,auVar155,auVar45);
                      auVar17._8_4_ = 0x40400000;
                      auVar17._0_8_ = 0x4040000040400000;
                      auVar17._12_4_ = 0x40400000;
                      auVar90._0_16_ = vmulps_avx512vl(auVar45,auVar17);
                      pGVar9 = (context->scene->geometries).items[uVar36].ptr;
                      if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x240)) == 0) {
LAB_01d3f1a2:
                        bVar31 = 0;
                      }
                      else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                              (bVar31 = 1, pGVar9->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                        auVar144._0_4_ = fVar210 * (float)local_5c0._0_4_;
                        auVar144._4_4_ = fVar210 * (float)local_5c0._4_4_;
                        auVar144._8_4_ = fVar210 * fStack_5b8;
                        auVar144._12_4_ = fVar210 * fStack_5b4;
                        auVar132._4_4_ = fVar211;
                        auVar132._0_4_ = fVar211;
                        auVar132._8_4_ = fVar211;
                        auVar132._12_4_ = fVar211;
                        auVar45 = vfmadd132ps_fma(auVar132,auVar144,local_5b0);
                        auVar127._4_4_ = fVar200;
                        auVar127._0_4_ = fVar200;
                        auVar127._8_4_ = fVar200;
                        auVar127._12_4_ = fVar200;
                        auVar45 = vfmadd132ps_fma(auVar127,auVar45,local_5a0);
                        auVar118._4_4_ = fVar105;
                        auVar118._0_4_ = fVar105;
                        auVar118._8_4_ = fVar105;
                        auVar118._12_4_ = fVar105;
                        auVar44 = vfmadd132ps_fma(auVar118,auVar45,local_590);
                        auVar45 = vshufps_avx(auVar44,auVar44,0xc9);
                        auVar43 = vshufps_avx(auVar90._0_16_,auVar90._0_16_,0xc9);
                        auVar119._0_4_ = auVar44._0_4_ * auVar43._0_4_;
                        auVar119._4_4_ = auVar44._4_4_ * auVar43._4_4_;
                        auVar119._8_4_ = auVar44._8_4_ * auVar43._8_4_;
                        auVar119._12_4_ = auVar44._12_4_ * auVar43._12_4_;
                        auVar45 = vfmsub231ps_fma(auVar119,auVar90._0_16_,auVar45);
                        local_200 = vbroadcastss_avx512f(auVar42);
                        auVar110 = vbroadcastss_avx512f(ZEXT416(1));
                        local_1c0 = vpermps_avx512f(auVar110,ZEXT1664(auVar42));
                        auVar110 = vpermps_avx512f(auVar110,ZEXT1664(auVar45));
                        auVar241 = vbroadcastss_avx512f(ZEXT416(2));
                        local_280 = vpermps_avx512f(auVar241,ZEXT1664(auVar45));
                        local_240 = vbroadcastss_avx512f(auVar45);
                        local_2c0[0] = (RTCHitN)auVar110[0];
                        local_2c0[1] = (RTCHitN)auVar110[1];
                        local_2c0[2] = (RTCHitN)auVar110[2];
                        local_2c0[3] = (RTCHitN)auVar110[3];
                        local_2c0[4] = (RTCHitN)auVar110[4];
                        local_2c0[5] = (RTCHitN)auVar110[5];
                        local_2c0[6] = (RTCHitN)auVar110[6];
                        local_2c0[7] = (RTCHitN)auVar110[7];
                        local_2c0[8] = (RTCHitN)auVar110[8];
                        local_2c0[9] = (RTCHitN)auVar110[9];
                        local_2c0[10] = (RTCHitN)auVar110[10];
                        local_2c0[0xb] = (RTCHitN)auVar110[0xb];
                        local_2c0[0xc] = (RTCHitN)auVar110[0xc];
                        local_2c0[0xd] = (RTCHitN)auVar110[0xd];
                        local_2c0[0xe] = (RTCHitN)auVar110[0xe];
                        local_2c0[0xf] = (RTCHitN)auVar110[0xf];
                        local_2c0[0x10] = (RTCHitN)auVar110[0x10];
                        local_2c0[0x11] = (RTCHitN)auVar110[0x11];
                        local_2c0[0x12] = (RTCHitN)auVar110[0x12];
                        local_2c0[0x13] = (RTCHitN)auVar110[0x13];
                        local_2c0[0x14] = (RTCHitN)auVar110[0x14];
                        local_2c0[0x15] = (RTCHitN)auVar110[0x15];
                        local_2c0[0x16] = (RTCHitN)auVar110[0x16];
                        local_2c0[0x17] = (RTCHitN)auVar110[0x17];
                        local_2c0[0x18] = (RTCHitN)auVar110[0x18];
                        local_2c0[0x19] = (RTCHitN)auVar110[0x19];
                        local_2c0[0x1a] = (RTCHitN)auVar110[0x1a];
                        local_2c0[0x1b] = (RTCHitN)auVar110[0x1b];
                        local_2c0[0x1c] = (RTCHitN)auVar110[0x1c];
                        local_2c0[0x1d] = (RTCHitN)auVar110[0x1d];
                        local_2c0[0x1e] = (RTCHitN)auVar110[0x1e];
                        local_2c0[0x1f] = (RTCHitN)auVar110[0x1f];
                        local_2c0[0x20] = (RTCHitN)auVar110[0x20];
                        local_2c0[0x21] = (RTCHitN)auVar110[0x21];
                        local_2c0[0x22] = (RTCHitN)auVar110[0x22];
                        local_2c0[0x23] = (RTCHitN)auVar110[0x23];
                        local_2c0[0x24] = (RTCHitN)auVar110[0x24];
                        local_2c0[0x25] = (RTCHitN)auVar110[0x25];
                        local_2c0[0x26] = (RTCHitN)auVar110[0x26];
                        local_2c0[0x27] = (RTCHitN)auVar110[0x27];
                        local_2c0[0x28] = (RTCHitN)auVar110[0x28];
                        local_2c0[0x29] = (RTCHitN)auVar110[0x29];
                        local_2c0[0x2a] = (RTCHitN)auVar110[0x2a];
                        local_2c0[0x2b] = (RTCHitN)auVar110[0x2b];
                        local_2c0[0x2c] = (RTCHitN)auVar110[0x2c];
                        local_2c0[0x2d] = (RTCHitN)auVar110[0x2d];
                        local_2c0[0x2e] = (RTCHitN)auVar110[0x2e];
                        local_2c0[0x2f] = (RTCHitN)auVar110[0x2f];
                        local_2c0[0x30] = (RTCHitN)auVar110[0x30];
                        local_2c0[0x31] = (RTCHitN)auVar110[0x31];
                        local_2c0[0x32] = (RTCHitN)auVar110[0x32];
                        local_2c0[0x33] = (RTCHitN)auVar110[0x33];
                        local_2c0[0x34] = (RTCHitN)auVar110[0x34];
                        local_2c0[0x35] = (RTCHitN)auVar110[0x35];
                        local_2c0[0x36] = (RTCHitN)auVar110[0x36];
                        local_2c0[0x37] = (RTCHitN)auVar110[0x37];
                        local_2c0[0x38] = (RTCHitN)auVar110[0x38];
                        local_2c0[0x39] = (RTCHitN)auVar110[0x39];
                        local_2c0[0x3a] = (RTCHitN)auVar110[0x3a];
                        local_2c0[0x3b] = (RTCHitN)auVar110[0x3b];
                        local_2c0[0x3c] = (RTCHitN)auVar110[0x3c];
                        local_2c0[0x3d] = (RTCHitN)auVar110[0x3d];
                        local_2c0[0x3e] = (RTCHitN)auVar110[0x3e];
                        local_2c0[0x3f] = (RTCHitN)auVar110[0x3f];
                        local_180 = local_300._0_8_;
                        uStack_178 = local_300._8_8_;
                        uStack_170 = local_300._16_8_;
                        uStack_168 = local_300._24_8_;
                        uStack_160 = local_300._32_8_;
                        uStack_158 = local_300._40_8_;
                        uStack_150 = local_300._48_8_;
                        uStack_148 = local_300._56_8_;
                        auVar110 = vmovdqa64_avx512f(local_340);
                        local_140 = vmovdqa64_avx512f(auVar110);
                        vpcmpeqd_avx2(auVar110._0_32_,auVar110._0_32_);
                        local_100 = vbroadcastss_avx512f(ZEXT416(context->user->instID[0]));
                        local_c0 = vbroadcastss_avx512f(ZEXT416(context->user->instPrimID[0]));
                        *(float *)(ray + k * 4 + 0x200) = auVar52._0_4_;
                        auVar104 = vmovdqa64_avx512f(local_380);
                        local_400 = vmovdqa64_avx512f(auVar104);
                        local_5f0.valid = (int *)local_400;
                        local_5f0.geometryUserPtr = pGVar9->userPtr;
                        local_5f0.context = context->user;
                        local_5f0.ray = (RTCRayN *)ray;
                        local_5f0.hit = local_2c0;
                        local_5f0.N = 0x10;
                        if (pGVar9->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                          (*pGVar9->occlusionFilterN)(&local_5f0);
                          auVar42 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                          auVar244 = ZEXT1664(auVar42);
                          auVar42 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                          auVar248 = ZEXT1664(auVar42);
                          auVar104 = vmovdqa64_avx512f(local_400);
                        }
                        uVar13 = vptestmd_avx512f(auVar104,auVar104);
                        auVar246._32_32_ = auVar104._32_32_;
                        if ((short)uVar13 == 0) {
                          auVar42 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
                          auVar110 = ZEXT1664(auVar42);
                          auVar42 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                          auVar241 = ZEXT1664(auVar42);
                          auVar72 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                          auVar242 = ZEXT3264(auVar72);
                          auVar42 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                          auVar243 = ZEXT1664(auVar42);
                          auVar246._0_32_ = _DAT_01feed20;
                          auVar245 = ZEXT3264(_DAT_01feed20);
                          auVar90._16_48_ = auVar246._16_48_;
                          auVar42 = vxorps_avx512vl(auVar103._0_16_,auVar103._0_16_);
                          auVar246 = ZEXT1664(auVar42);
                          auVar90._0_16_ = auVar89._0_16_;
                        }
                        else {
                          p_Var10 = context->args->filter;
                          if (p_Var10 == (RTCFilterFunctionN)0x0) {
                            auVar42 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
                            auVar110 = ZEXT1664(auVar42);
                            auVar42 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                            auVar241 = ZEXT1664(auVar42);
                            auVar72 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                            auVar242 = ZEXT3264(auVar72);
                            auVar42 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                            auVar243 = ZEXT1664(auVar42);
                            auVar245 = ZEXT3264(_DAT_01feed20);
                            auVar42 = vxorps_avx512vl(auVar103._0_16_,auVar103._0_16_);
                            auVar246 = ZEXT1664(auVar42);
                          }
                          else {
                            auVar42 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
                            auVar110 = ZEXT1664(auVar42);
                            auVar42 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                            auVar241 = ZEXT1664(auVar42);
                            auVar72 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                            auVar242 = ZEXT3264(auVar72);
                            auVar42 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                            auVar243 = ZEXT1664(auVar42);
                            auVar245 = ZEXT3264(_DAT_01feed20);
                            auVar42 = vxorps_avx512vl(auVar103._0_16_,auVar103._0_16_);
                            auVar246 = ZEXT1664(auVar42);
                            if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                               (((pGVar9->field_8).field_0x2 & 0x40) != 0)) {
                              (*p_Var10)(&local_5f0);
                              auVar42 = vxorps_avx512vl(auVar42,auVar42);
                              auVar246 = ZEXT1664(auVar42);
                              auVar245 = ZEXT3264(_DAT_01feed20);
                              auVar42 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                              auVar244 = ZEXT1664(auVar42);
                              auVar42 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                              auVar243 = ZEXT1664(auVar42);
                              auVar72 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                              auVar242 = ZEXT3264(auVar72);
                              auVar42 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                              auVar241 = ZEXT1664(auVar42);
                              auVar42 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
                              auVar110 = ZEXT1664(auVar42);
                              auVar42 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                              auVar248 = ZEXT1664(auVar42);
                              auVar104 = vmovdqa64_avx512f(local_400);
                            }
                          }
                          auVar247 = ZEXT464(0x3f800000);
                          uVar35 = vptestmd_avx512f(auVar104,auVar104);
                          auVar104 = vbroadcastss_avx512f(ZEXT416(0xff800000));
                          bVar40 = (bool)((byte)uVar35 & 1);
                          auVar90._0_4_ =
                               (uint)bVar40 * auVar104._0_4_ |
                               (uint)!bVar40 * *(int *)(local_5f0.ray + 0x200);
                          bVar40 = (bool)((byte)(uVar35 >> 1) & 1);
                          auVar90._4_4_ =
                               (uint)bVar40 * auVar104._4_4_ |
                               (uint)!bVar40 * *(int *)(local_5f0.ray + 0x204);
                          bVar40 = (bool)((byte)(uVar35 >> 2) & 1);
                          auVar90._8_4_ =
                               (uint)bVar40 * auVar104._8_4_ |
                               (uint)!bVar40 * *(int *)(local_5f0.ray + 0x208);
                          bVar40 = (bool)((byte)(uVar35 >> 3) & 1);
                          auVar90._12_4_ =
                               (uint)bVar40 * auVar104._12_4_ |
                               (uint)!bVar40 * *(int *)(local_5f0.ray + 0x20c);
                          bVar40 = (bool)((byte)(uVar35 >> 4) & 1);
                          auVar90._16_4_ =
                               (uint)bVar40 * auVar104._16_4_ |
                               (uint)!bVar40 * *(int *)(local_5f0.ray + 0x210);
                          bVar40 = (bool)((byte)(uVar35 >> 5) & 1);
                          auVar90._20_4_ =
                               (uint)bVar40 * auVar104._20_4_ |
                               (uint)!bVar40 * *(int *)(local_5f0.ray + 0x214);
                          bVar40 = (bool)((byte)(uVar35 >> 6) & 1);
                          auVar90._24_4_ =
                               (uint)bVar40 * auVar104._24_4_ |
                               (uint)!bVar40 * *(int *)(local_5f0.ray + 0x218);
                          bVar40 = (bool)((byte)(uVar35 >> 7) & 1);
                          auVar90._28_4_ =
                               (uint)bVar40 * auVar104._28_4_ |
                               (uint)!bVar40 * *(int *)(local_5f0.ray + 0x21c);
                          bVar40 = (bool)((byte)(uVar35 >> 8) & 1);
                          auVar90._32_4_ =
                               (uint)bVar40 * auVar104._32_4_ |
                               (uint)!bVar40 * *(int *)(local_5f0.ray + 0x220);
                          bVar40 = (bool)((byte)(uVar35 >> 9) & 1);
                          auVar90._36_4_ =
                               (uint)bVar40 * auVar104._36_4_ |
                               (uint)!bVar40 * *(int *)(local_5f0.ray + 0x224);
                          bVar40 = (bool)((byte)(uVar35 >> 10) & 1);
                          auVar90._40_4_ =
                               (uint)bVar40 * auVar104._40_4_ |
                               (uint)!bVar40 * *(int *)(local_5f0.ray + 0x228);
                          bVar40 = (bool)((byte)(uVar35 >> 0xb) & 1);
                          auVar90._44_4_ =
                               (uint)bVar40 * auVar104._44_4_ |
                               (uint)!bVar40 * *(int *)(local_5f0.ray + 0x22c);
                          bVar40 = (bool)((byte)(uVar35 >> 0xc) & 1);
                          auVar90._48_4_ =
                               (uint)bVar40 * auVar104._48_4_ |
                               (uint)!bVar40 * *(int *)(local_5f0.ray + 0x230);
                          bVar40 = (bool)((byte)(uVar35 >> 0xd) & 1);
                          auVar90._52_4_ =
                               (uint)bVar40 * auVar104._52_4_ |
                               (uint)!bVar40 * *(int *)(local_5f0.ray + 0x234);
                          bVar40 = (bool)((byte)(uVar35 >> 0xe) & 1);
                          auVar90._56_4_ =
                               (uint)bVar40 * auVar104._56_4_ |
                               (uint)!bVar40 * *(int *)(local_5f0.ray + 0x238);
                          bVar40 = SUB81(uVar35 >> 0xf,0);
                          auVar90._60_4_ =
                               (uint)bVar40 * auVar104._60_4_ |
                               (uint)!bVar40 * *(int *)(local_5f0.ray + 0x23c);
                          *(undefined1 (*) [64])(local_5f0.ray + 0x200) = auVar90;
                          bVar31 = 1;
                          if ((short)uVar35 != 0) goto LAB_01d3f1a4;
                        }
                        auVar247 = ZEXT464(0x3f800000);
                        *(float *)(ray + k * 4 + 0x200) = fVar212;
                        goto LAB_01d3f1a2;
                      }
LAB_01d3f1a4:
                      bVar37 = (bool)(bVar37 | bVar31);
                    }
                  }
                }
              }
            }
          }
          break;
        }
        lVar30 = lVar30 + -1;
      } while (lVar30 != 0);
      goto LAB_01d3e332;
    }
    auVar45 = vinsertps_avx(auVar138,auVar56,0x10);
  } while( true );
}

Assistant:

static __forceinline bool occluded_n(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);

          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }